

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_16777232,_true,_embree::avx::SubGridMBIntersector1Pluecker<8,_true>_>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  ushort uVar4;
  ushort uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  AABBNodeMB4D *node1;
  ulong uVar56;
  long lVar57;
  long lVar58;
  ulong uVar59;
  byte bVar60;
  uint uVar61;
  ulong uVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  Geometry *pGVar66;
  ulong uVar67;
  undefined4 uVar68;
  RTCIntersectArguments *pRVar69;
  ulong *puVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar84;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  float fVar83;
  undefined1 auVar82 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar94;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar92 [32];
  float fVar95;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar93 [64];
  float fVar96;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar107;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar108;
  undefined1 auVar106 [64];
  float fVar109;
  float fVar123;
  undefined1 auVar110 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar124;
  undefined1 auVar122 [64];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar125;
  float fVar136;
  float fVar137;
  undefined1 auVar126 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar138;
  undefined1 auVar133 [32];
  float fVar142;
  undefined1 auVar134 [32];
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar135 [64];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar143 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar144 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar158;
  float fVar159;
  undefined1 auVar165 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar172;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar178;
  float fVar180;
  float fVar182;
  undefined1 auVar169 [32];
  float fVar171;
  float fVar173;
  float fVar177;
  float fVar179;
  float fVar181;
  undefined1 auVar170 [64];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar183;
  undefined1 auVar189 [16];
  undefined1 auVar184 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar185 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar186 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar203;
  float fVar206;
  float fVar208;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar201;
  float fVar202;
  float fVar204;
  float fVar205;
  float fVar207;
  undefined1 auVar200 [64];
  float fVar209;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar226;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar224;
  float fVar225;
  float fVar227;
  float fVar228;
  undefined1 auVar223 [64];
  float fVar229;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar239;
  float fVar243;
  undefined1 auVar235 [32];
  float fVar237;
  float fVar238;
  float fVar240;
  float fVar241;
  float fVar242;
  undefined1 auVar236 [64];
  float fVar244;
  float fVar245;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar252 [64];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [64];
  float fVar270;
  float fVar276;
  undefined1 auVar271 [16];
  undefined1 auVar272 [32];
  float fVar274;
  float fVar275;
  float fVar277;
  float fVar278;
  float fVar279;
  undefined1 auVar273 [64];
  undefined1 auVar280 [16];
  undefined1 auVar281 [32];
  undefined1 auVar282 [64];
  float fVar283;
  float fVar284;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  undefined1 auVar285 [64];
  float fVar298;
  float fVar299;
  undefined1 auVar300 [32];
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  undefined1 auVar301 [64];
  UVIdentity<8> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  NodeRef stack [564];
  undefined1 local_1849;
  Ray *local_1848;
  RayQueryContext *local_1840;
  uint local_1834;
  uint local_1830;
  int local_182c;
  ulong *local_1828;
  undefined1 local_1820 [8];
  float fStack_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float fStack_1808;
  float fStack_1804;
  undefined1 local_1800 [32];
  undefined1 local_17d0 [16];
  undefined1 local_17c0 [32];
  undefined1 local_17a0 [32];
  undefined1 local_1780 [8];
  float fStack_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float fStack_1768;
  float fStack_1764;
  long local_1750;
  ulong local_1748;
  ulong local_1740;
  ulong local_1738;
  long local_1730;
  long local_1728;
  ulong local_1720;
  long local_1718;
  long local_1710;
  Scene *local_1708;
  float local_1700;
  float local_16fc;
  float local_16f8;
  undefined4 local_16f4;
  undefined4 local_16f0;
  undefined4 local_16ec;
  undefined4 local_16e8;
  uint local_16e4;
  uint local_16e0;
  RTCFilterFunctionNArguments local_16d0;
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [8];
  float fStack_15f8;
  float fStack_15f4;
  float fStack_15f0;
  float fStack_15ec;
  float fStack_15e8;
  undefined1 local_15e0 [8];
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 *local_1300;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  float local_1220 [4];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  undefined4 uStack_1204;
  ulong local_1200 [570];
  
  local_1200[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200[0] != 8) {
    fVar158 = ray->tfar;
    if (0.0 <= fVar158) {
      puVar70 = local_1200 + 1;
      aVar3 = (ray->dir).field_0;
      auVar75 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar147._8_4_ = 0x7fffffff;
      auVar147._0_8_ = 0x7fffffff7fffffff;
      auVar147._12_4_ = 0x7fffffff;
      auVar147 = vandps_avx((undefined1  [16])aVar3,auVar147);
      auVar85._8_4_ = 0x219392ef;
      auVar85._0_8_ = 0x219392ef219392ef;
      auVar85._12_4_ = 0x219392ef;
      auVar147 = vcmpps_avx(auVar147,auVar85,1);
      auVar126._8_4_ = 0x3f800000;
      auVar126._0_8_ = 0x3f8000003f800000;
      auVar126._12_4_ = 0x3f800000;
      auVar85 = vdivps_avx(auVar126,(undefined1  [16])aVar3);
      auVar77._8_4_ = 0x5d5e0b6b;
      auVar77._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar77._12_4_ = 0x5d5e0b6b;
      auVar147 = vblendvps_avx(auVar85,auVar77,auVar147);
      auVar110._0_4_ = auVar147._0_4_ * 0.99999964;
      auVar110._4_4_ = auVar147._4_4_ * 0.99999964;
      auVar110._8_4_ = auVar147._8_4_ * 0.99999964;
      auVar110._12_4_ = auVar147._12_4_ * 0.99999964;
      uVar68 = *(undefined4 *)&(ray->org).field_0;
      local_14a0._4_4_ = uVar68;
      local_14a0._0_4_ = uVar68;
      local_14a0._8_4_ = uVar68;
      local_14a0._12_4_ = uVar68;
      local_14a0._16_4_ = uVar68;
      local_14a0._20_4_ = uVar68;
      local_14a0._24_4_ = uVar68;
      local_14a0._28_4_ = uVar68;
      auVar301 = ZEXT3264(local_14a0);
      uVar68 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_14e0._4_4_ = uVar68;
      local_14e0._0_4_ = uVar68;
      local_14e0._8_4_ = uVar68;
      local_14e0._12_4_ = uVar68;
      local_14e0._16_4_ = uVar68;
      local_14e0._20_4_ = uVar68;
      local_14e0._24_4_ = uVar68;
      local_14e0._28_4_ = uVar68;
      auVar170 = ZEXT3264(local_14e0);
      uVar68 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_15c0._4_4_ = uVar68;
      local_15c0._0_4_ = uVar68;
      local_15c0._8_4_ = uVar68;
      local_15c0._12_4_ = uVar68;
      local_15c0._16_4_ = uVar68;
      local_15c0._20_4_ = uVar68;
      local_15c0._24_4_ = uVar68;
      local_15c0._28_4_ = uVar68;
      auVar200 = ZEXT3264(local_15c0);
      auVar100._0_4_ = auVar147._0_4_ * 1.0000004;
      auVar100._4_4_ = auVar147._4_4_ * 1.0000004;
      auVar100._8_4_ = auVar147._8_4_ * 1.0000004;
      auVar100._12_4_ = auVar147._12_4_ * 1.0000004;
      auVar147 = vshufps_avx(auVar110,auVar110,0);
      register0x00001410 = auVar147;
      _local_15e0 = auVar147;
      auVar223 = ZEXT3264(_local_15e0);
      auVar147 = vmovshdup_avx(auVar110);
      auVar135 = ZEXT1664(auVar147);
      auVar85 = vshufps_avx(auVar110,auVar110,0x55);
      register0x00001450 = auVar85;
      _local_1600 = auVar85;
      auVar236 = ZEXT3264(_local_1600);
      auVar85 = vshufpd_avx(auVar110,auVar110,1);
      auVar126 = vshufps_avx(auVar110,auVar110,0xaa);
      local_1500._16_16_ = auVar126;
      local_1500._0_16_ = auVar126;
      auVar252 = ZEXT3264(local_1500);
      auVar126 = vshufps_avx(auVar100,auVar100,0);
      local_1520._16_16_ = auVar126;
      local_1520._0_16_ = auVar126;
      auVar269 = ZEXT3264(local_1520);
      auVar126 = vshufps_avx(auVar100,auVar100,0x55);
      auVar122 = ZEXT1664(auVar126);
      local_1540._16_16_ = auVar126;
      local_1540._0_16_ = auVar126;
      auVar273 = ZEXT3264(local_1540);
      auVar126 = vshufps_avx(auVar100,auVar100,0xaa);
      auVar106 = ZEXT1664(auVar126);
      local_1580._16_16_ = auVar126;
      local_1580._0_16_ = auVar126;
      auVar282 = ZEXT3264(local_1580);
      uVar59 = (ulong)(auVar110._0_4_ < 0.0) << 5;
      uVar71 = (ulong)(auVar147._0_4_ < 0.0) << 5 | 0x40;
      uVar72 = (ulong)(auVar85._0_4_ < 0.0) << 5 | 0x80;
      uVar73 = uVar59 ^ 0x20;
      uVar74 = uVar71 ^ 0x20;
      auVar147 = vshufps_avx(auVar75,auVar75,0);
      auVar93 = ZEXT1664(auVar147);
      local_1460 = ZEXT1632(auVar147);
      local_1620._16_16_ = auVar147;
      local_1620._0_16_ = auVar147;
      auVar157 = ZEXT3264(local_1620);
      auVar147 = vshufps_avx(ZEXT416((uint)fVar158),ZEXT416((uint)fVar158),0);
      local_1480 = ZEXT1632(auVar147);
      local_15a0._16_16_ = auVar147;
      local_15a0._0_16_ = auVar147;
      auVar285 = ZEXT3264(local_15a0);
      local_1560._16_16_ = mm_lookupmask_ps._240_16_;
      local_1560._0_16_ = mm_lookupmask_ps._240_16_;
      local_1440 = vperm2f128_avx(local_1560,mm_lookupmask_ps._0_32_,2);
      local_1740 = uVar59;
      local_1748 = uVar71;
      local_1848 = ray;
      local_1840 = context;
LAB_00e836da:
      if (puVar70 != local_1200) {
        uVar67 = puVar70[-1];
        puVar70 = puVar70 + -1;
LAB_00e836eb:
        fVar158 = (ray->dir).field_0.m128[3];
        auVar79._4_4_ = fVar158;
        auVar79._0_4_ = fVar158;
        auVar79._8_4_ = fVar158;
        auVar79._12_4_ = fVar158;
        auVar79._16_4_ = fVar158;
        auVar79._20_4_ = fVar158;
        auVar79._24_4_ = fVar158;
        auVar79._28_4_ = fVar158;
        while ((uVar67 & 8) == 0) {
          uVar56 = uVar67 & 0xfffffffffffffff0;
          pfVar2 = (float *)(uVar56 + 0x100 + uVar59);
          pfVar1 = (float *)(uVar56 + 0x40 + uVar59);
          auVar88._0_4_ = fVar158 * *pfVar2 + *pfVar1;
          auVar88._4_4_ = fVar158 * pfVar2[1] + pfVar1[1];
          auVar88._8_4_ = fVar158 * pfVar2[2] + pfVar1[2];
          auVar88._12_4_ = fVar158 * pfVar2[3] + pfVar1[3];
          auVar88._16_4_ = fVar158 * pfVar2[4] + pfVar1[4];
          auVar88._20_4_ = fVar158 * pfVar2[5] + pfVar1[5];
          auVar88._24_4_ = fVar158 * pfVar2[6] + pfVar1[6];
          auVar88._28_4_ = auVar93._28_4_ + pfVar1[7];
          auVar89 = vsubps_avx(auVar88,auVar301._0_32_);
          pfVar2 = (float *)(uVar56 + 0x100 + uVar71);
          pfVar1 = (float *)(uVar56 + 0x40 + uVar71);
          auVar103._0_4_ = fVar158 * *pfVar2 + *pfVar1;
          auVar103._4_4_ = fVar158 * pfVar2[1] + pfVar1[1];
          auVar103._8_4_ = fVar158 * pfVar2[2] + pfVar1[2];
          auVar103._12_4_ = fVar158 * pfVar2[3] + pfVar1[3];
          auVar103._16_4_ = fVar158 * pfVar2[4] + pfVar1[4];
          auVar103._20_4_ = fVar158 * pfVar2[5] + pfVar1[5];
          auVar103._24_4_ = fVar158 * pfVar2[6] + pfVar1[6];
          auVar103._28_4_ = auVar106._28_4_ + pfVar1[7];
          auVar15._4_4_ = auVar223._4_4_ * auVar89._4_4_;
          auVar15._0_4_ = auVar223._0_4_ * auVar89._0_4_;
          auVar15._8_4_ = auVar223._8_4_ * auVar89._8_4_;
          auVar15._12_4_ = auVar223._12_4_ * auVar89._12_4_;
          auVar15._16_4_ = auVar223._16_4_ * auVar89._16_4_;
          auVar15._20_4_ = auVar223._20_4_ * auVar89._20_4_;
          auVar15._24_4_ = auVar223._24_4_ * auVar89._24_4_;
          auVar15._28_4_ = auVar89._28_4_;
          auVar89 = vsubps_avx(auVar103,auVar170._0_32_);
          pfVar2 = (float *)(uVar56 + 0x100 + uVar72);
          auVar16._4_4_ = auVar236._4_4_ * auVar89._4_4_;
          auVar16._0_4_ = auVar236._0_4_ * auVar89._0_4_;
          auVar16._8_4_ = auVar236._8_4_ * auVar89._8_4_;
          auVar16._12_4_ = auVar236._12_4_ * auVar89._12_4_;
          auVar16._16_4_ = auVar236._16_4_ * auVar89._16_4_;
          auVar16._20_4_ = auVar236._20_4_ * auVar89._20_4_;
          auVar16._24_4_ = auVar236._24_4_ * auVar89._24_4_;
          auVar16._28_4_ = auVar89._28_4_;
          pfVar1 = (float *)(uVar56 + 0x40 + uVar72);
          auVar115._0_4_ = fVar158 * *pfVar2 + *pfVar1;
          auVar115._4_4_ = fVar158 * pfVar2[1] + pfVar1[1];
          auVar115._8_4_ = fVar158 * pfVar2[2] + pfVar1[2];
          auVar115._12_4_ = fVar158 * pfVar2[3] + pfVar1[3];
          auVar115._16_4_ = fVar158 * pfVar2[4] + pfVar1[4];
          auVar115._20_4_ = fVar158 * pfVar2[5] + pfVar1[5];
          auVar115._24_4_ = fVar158 * pfVar2[6] + pfVar1[6];
          auVar115._28_4_ = auVar122._28_4_ + pfVar1[7];
          auVar12 = vsubps_avx(auVar115,auVar200._0_32_);
          auVar17._4_4_ = auVar252._4_4_ * auVar12._4_4_;
          auVar17._0_4_ = auVar252._0_4_ * auVar12._0_4_;
          auVar17._8_4_ = auVar252._8_4_ * auVar12._8_4_;
          auVar17._12_4_ = auVar252._12_4_ * auVar12._12_4_;
          auVar17._16_4_ = auVar252._16_4_ * auVar12._16_4_;
          auVar17._20_4_ = auVar252._20_4_ * auVar12._20_4_;
          auVar17._24_4_ = auVar252._24_4_ * auVar12._24_4_;
          auVar17._28_4_ = auVar12._28_4_;
          auVar89 = vmaxps_avx(auVar16,auVar17);
          auVar10 = vmaxps_avx(auVar157._0_32_,auVar15);
          auVar11 = vmaxps_avx(auVar10,auVar89);
          pfVar2 = (float *)(uVar56 + 0x100 + uVar73);
          pfVar1 = (float *)(uVar56 + 0x40 + uVar73);
          auVar104._0_4_ = fVar158 * *pfVar2 + *pfVar1;
          auVar104._4_4_ = fVar158 * pfVar2[1] + pfVar1[1];
          auVar104._8_4_ = fVar158 * pfVar2[2] + pfVar1[2];
          auVar104._12_4_ = fVar158 * pfVar2[3] + pfVar1[3];
          auVar104._16_4_ = fVar158 * pfVar2[4] + pfVar1[4];
          auVar104._20_4_ = fVar158 * pfVar2[5] + pfVar1[5];
          auVar104._24_4_ = fVar158 * pfVar2[6] + pfVar1[6];
          auVar104._28_4_ = auVar89._28_4_ + pfVar1[7];
          auVar89 = vsubps_avx(auVar104,auVar301._0_32_);
          auVar18._4_4_ = auVar269._4_4_ * auVar89._4_4_;
          auVar18._0_4_ = auVar269._0_4_ * auVar89._0_4_;
          auVar18._8_4_ = auVar269._8_4_ * auVar89._8_4_;
          auVar18._12_4_ = auVar269._12_4_ * auVar89._12_4_;
          auVar18._16_4_ = auVar269._16_4_ * auVar89._16_4_;
          auVar18._20_4_ = auVar269._20_4_ * auVar89._20_4_;
          auVar18._24_4_ = auVar269._24_4_ * auVar89._24_4_;
          auVar18._28_4_ = auVar89._28_4_;
          pfVar2 = (float *)(uVar56 + 0x100 + uVar74);
          pfVar1 = (float *)(uVar56 + 0x40 + uVar74);
          auVar116._0_4_ = fVar158 * *pfVar2 + *pfVar1;
          auVar116._4_4_ = fVar158 * pfVar2[1] + pfVar1[1];
          auVar116._8_4_ = fVar158 * pfVar2[2] + pfVar1[2];
          auVar116._12_4_ = fVar158 * pfVar2[3] + pfVar1[3];
          auVar116._16_4_ = fVar158 * pfVar2[4] + pfVar1[4];
          auVar116._20_4_ = fVar158 * pfVar2[5] + pfVar1[5];
          auVar116._24_4_ = fVar158 * pfVar2[6] + pfVar1[6];
          auVar116._28_4_ = auVar12._28_4_ + pfVar1[7];
          auVar89 = vsubps_avx(auVar116,auVar170._0_32_);
          auVar19._4_4_ = auVar273._4_4_ * auVar89._4_4_;
          auVar19._0_4_ = auVar273._0_4_ * auVar89._0_4_;
          auVar19._8_4_ = auVar273._8_4_ * auVar89._8_4_;
          auVar19._12_4_ = auVar273._12_4_ * auVar89._12_4_;
          auVar19._16_4_ = auVar273._16_4_ * auVar89._16_4_;
          auVar19._20_4_ = auVar273._20_4_ * auVar89._20_4_;
          auVar19._24_4_ = auVar273._24_4_ * auVar89._24_4_;
          auVar19._28_4_ = auVar89._28_4_;
          pfVar2 = (float *)(uVar56 + 0x100 + (uVar72 ^ 0x20));
          pfVar1 = (float *)(uVar56 + 0x40 + (uVar72 ^ 0x20));
          auVar129._0_4_ = fVar158 * *pfVar2 + *pfVar1;
          auVar129._4_4_ = fVar158 * pfVar2[1] + pfVar1[1];
          auVar129._8_4_ = fVar158 * pfVar2[2] + pfVar1[2];
          auVar129._12_4_ = fVar158 * pfVar2[3] + pfVar1[3];
          auVar129._16_4_ = fVar158 * pfVar2[4] + pfVar1[4];
          auVar129._20_4_ = fVar158 * pfVar2[5] + pfVar1[5];
          auVar129._24_4_ = fVar158 * pfVar2[6] + pfVar1[6];
          auVar129._28_4_ = auVar135._28_4_ + pfVar1[7];
          auVar89 = vsubps_avx(auVar129,auVar200._0_32_);
          auVar20._4_4_ = auVar282._4_4_ * auVar89._4_4_;
          auVar20._0_4_ = auVar282._0_4_ * auVar89._0_4_;
          auVar20._8_4_ = auVar282._8_4_ * auVar89._8_4_;
          auVar20._12_4_ = auVar282._12_4_ * auVar89._12_4_;
          auVar20._16_4_ = auVar282._16_4_ * auVar89._16_4_;
          auVar20._20_4_ = auVar282._20_4_ * auVar89._20_4_;
          auVar20._24_4_ = auVar282._24_4_ * auVar89._24_4_;
          auVar20._28_4_ = auVar89._28_4_;
          auVar135 = ZEXT3264(auVar20);
          auVar10 = vminps_avx(auVar19,auVar20);
          auVar89 = vminps_avx(auVar285._0_32_,auVar18);
          auVar89 = vminps_avx(auVar89,auVar10);
          auVar89 = vcmpps_avx(auVar11,auVar89,2);
          if (((uint)uVar67 & 7) == 6) {
            auVar11 = vcmpps_avx(*(undefined1 (*) [32])(uVar56 + 0x1c0),auVar79,2);
            auVar10 = vcmpps_avx(auVar79,*(undefined1 (*) [32])(uVar56 + 0x1e0),1);
            auVar11 = vandps_avx(auVar11,auVar10);
            auVar89 = vandps_avx(auVar11,auVar89);
          }
          auVar122 = ZEXT3264(auVar10);
          auVar147 = vpackssdw_avx(auVar89._0_16_,auVar89._16_16_);
          auVar85 = vpsllw_avx(auVar147,0xf);
          auVar93 = ZEXT1664(auVar85);
          auVar147 = vpacksswb_avx(auVar85,auVar85);
          auVar106 = ZEXT1664(auVar147);
          bVar60 = SUB161(auVar147 >> 7,0) & 1 | (SUB161(auVar147 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar147 >> 0x17,0) & 1) << 2 | (SUB161(auVar147 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar147 >> 0x27,0) & 1) << 4 | (SUB161(auVar147 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar147 >> 0x37,0) & 1) << 6 | SUB161(auVar147 >> 0x3f,0) << 7;
          This = (Intersectors *)0x0;
          if ((((((((auVar85 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar85 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar85 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar85 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar85 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar85 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar85 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar85[0xf]) goto LAB_00e836da;
          This = (Intersectors *)0x0;
          if (bVar60 != 0) {
            for (; (bVar60 >> (long)This & 1) == 0; This = (Intersectors *)((long)&This->ptr + 1)) {
            }
          }
          uVar67 = *(ulong *)(uVar56 + (long)This * 8);
          uVar61 = bVar60 - 1 & (uint)bVar60;
          uVar62 = (ulong)uVar61;
          if (uVar61 != 0) goto LAB_00e83834;
        }
        uVar56 = uVar67 & 0xfffffffffffffff0;
        local_1828 = puVar70;
        local_1750 = (ulong)((uint)uVar67 & 0xf) - 8;
        for (local_1728 = 0; local_1728 != local_1750; local_1728 = local_1728 + 1) {
          lVar57 = local_1728 * 0xe0;
          uVar67 = *(ulong *)(uVar56 + 0x40 + lVar57);
          auVar75._8_8_ = 0;
          auVar75._0_8_ = uVar67;
          auVar147 = vpmovzxbd_avx(auVar75);
          uVar62 = *(ulong *)(uVar56 + 0x44 + lVar57);
          auVar111._8_8_ = 0;
          auVar111._0_8_ = uVar62;
          auVar85 = vpmovzxbd_avx(auVar111);
          auVar130._16_16_ = auVar85;
          auVar130._0_16_ = auVar147;
          auVar86._8_8_ = 0;
          auVar86._0_8_ = *(ulong *)(uVar56 + 0x48 + lVar57);
          auVar147 = vpmovzxbd_avx(auVar86);
          auVar160._8_8_ = 0;
          auVar160._0_8_ = *(ulong *)(uVar56 + 0x4c + lVar57);
          auVar85 = vpmovzxbd_avx(auVar160);
          auVar148._16_16_ = auVar85;
          auVar148._0_16_ = auVar147;
          auVar147 = vpminub_avx(auVar75,auVar86);
          auVar76._8_8_ = 0;
          auVar76._0_8_ = uVar67;
          local_17d0 = vpcmpeqb_avx(auVar76,auVar147);
          auVar147 = vpminub_avx(auVar111,auVar160);
          auVar112._8_8_ = 0;
          auVar112._0_8_ = uVar62;
          auVar147 = vpcmpeqb_avx(auVar112,auVar147);
          local_1800._0_16_ = auVar147;
          auVar79 = vcvtdq2ps_avx(auVar130);
          fVar158 = *(float *)(uVar56 + 0x7c + lVar57);
          fVar94 = *(float *)(uVar56 + 0x70 + lVar57);
          auVar117._0_4_ = fVar94 + fVar158 * auVar79._0_4_;
          auVar117._4_4_ = fVar94 + fVar158 * auVar79._4_4_;
          auVar117._8_4_ = fVar94 + fVar158 * auVar79._8_4_;
          auVar117._12_4_ = fVar94 + fVar158 * auVar79._12_4_;
          auVar117._16_4_ = fVar94 + fVar158 * auVar79._16_4_;
          auVar117._20_4_ = fVar94 + fVar158 * auVar79._20_4_;
          auVar117._24_4_ = fVar94 + fVar158 * auVar79._24_4_;
          auVar117._28_4_ = fVar94 + auVar79._28_4_;
          auVar184._8_8_ = 0;
          auVar184._0_8_ = *(ulong *)(uVar56 + 0x88 + lVar57);
          auVar85 = vpmovzxbd_avx(auVar184);
          auVar210._8_8_ = 0;
          auVar210._0_8_ = *(ulong *)(uVar56 + 0x8c + lVar57);
          auVar75 = vpmovzxbd_avx(auVar210);
          auVar190._16_16_ = auVar75;
          auVar190._0_16_ = auVar85;
          auVar79 = vcvtdq2ps_avx(auVar190);
          fVar95 = *(float *)(uVar56 + 0xc4 + lVar57);
          fVar96 = *(float *)(uVar56 + 0xb8 + lVar57);
          auVar191._0_4_ = fVar96 + fVar95 * auVar79._0_4_;
          auVar191._4_4_ = fVar96 + fVar95 * auVar79._4_4_;
          auVar191._8_4_ = fVar96 + fVar95 * auVar79._8_4_;
          auVar191._12_4_ = fVar96 + fVar95 * auVar79._12_4_;
          auVar191._16_4_ = fVar96 + fVar95 * auVar79._16_4_;
          auVar191._20_4_ = fVar96 + fVar95 * auVar79._20_4_;
          auVar191._24_4_ = fVar96 + fVar95 * auVar79._24_4_;
          auVar191._28_4_ = fVar96 + auVar79._28_4_;
          auVar85 = ZEXT416((uint)(((ray->dir).field_0.m128[3] - *(float *)(uVar56 + 0xd0 + lVar57))
                                  * *(float *)(uVar56 + 0xd4 + lVar57)));
          auVar85 = vshufps_avx(auVar85,auVar85,0);
          auVar79 = vsubps_avx(auVar191,auVar117);
          fVar97 = auVar85._0_4_;
          fVar98 = auVar85._4_4_;
          fVar99 = auVar85._8_4_;
          fVar142 = auVar85._12_4_;
          auVar118._0_4_ = auVar117._0_4_ + fVar97 * auVar79._0_4_;
          auVar118._4_4_ = auVar117._4_4_ + fVar98 * auVar79._4_4_;
          auVar118._8_4_ = auVar117._8_4_ + fVar99 * auVar79._8_4_;
          auVar118._12_4_ = auVar117._12_4_ + fVar142 * auVar79._12_4_;
          auVar118._16_4_ = auVar117._16_4_ + fVar97 * auVar79._16_4_;
          auVar118._20_4_ = auVar117._20_4_ + fVar98 * auVar79._20_4_;
          auVar118._24_4_ = auVar117._24_4_ + fVar99 * auVar79._24_4_;
          auVar118._28_4_ = auVar117._28_4_ + auVar79._28_4_;
          auVar79 = vcvtdq2ps_avx(auVar148);
          auVar131._0_4_ = fVar94 + fVar158 * auVar79._0_4_;
          auVar131._4_4_ = fVar94 + fVar158 * auVar79._4_4_;
          auVar131._8_4_ = fVar94 + fVar158 * auVar79._8_4_;
          auVar131._12_4_ = fVar94 + fVar158 * auVar79._12_4_;
          auVar131._16_4_ = fVar94 + fVar158 * auVar79._16_4_;
          auVar131._20_4_ = fVar94 + fVar158 * auVar79._20_4_;
          auVar131._24_4_ = fVar94 + fVar158 * auVar79._24_4_;
          auVar131._28_4_ = fVar94 + fVar158;
          auVar143._8_8_ = 0;
          auVar143._0_8_ = *(ulong *)(uVar56 + 0x90 + lVar57);
          auVar85 = vpmovzxbd_avx(auVar143);
          auVar161._8_8_ = 0;
          auVar161._0_8_ = *(ulong *)(uVar56 + 0x94 + lVar57);
          auVar75 = vpmovzxbd_avx(auVar161);
          auVar149._16_16_ = auVar75;
          auVar149._0_16_ = auVar85;
          auVar79 = vcvtdq2ps_avx(auVar149);
          auVar150._0_4_ = fVar96 + fVar95 * auVar79._0_4_;
          auVar150._4_4_ = fVar96 + fVar95 * auVar79._4_4_;
          auVar150._8_4_ = fVar96 + fVar95 * auVar79._8_4_;
          auVar150._12_4_ = fVar96 + fVar95 * auVar79._12_4_;
          auVar150._16_4_ = fVar96 + fVar95 * auVar79._16_4_;
          auVar150._20_4_ = fVar96 + fVar95 * auVar79._20_4_;
          auVar150._24_4_ = fVar96 + fVar95 * auVar79._24_4_;
          auVar150._28_4_ = fVar96 + auVar79._28_4_;
          auVar79 = vsubps_avx(auVar150,auVar131);
          local_1820._4_4_ = auVar131._4_4_ + fVar98 * auVar79._4_4_;
          local_1820._0_4_ = auVar131._0_4_ + fVar97 * auVar79._0_4_;
          fStack_1818 = auVar131._8_4_ + fVar99 * auVar79._8_4_;
          fStack_1814 = auVar131._12_4_ + fVar142 * auVar79._12_4_;
          fStack_1810 = auVar131._16_4_ + fVar97 * auVar79._16_4_;
          fStack_180c = auVar131._20_4_ + fVar98 * auVar79._20_4_;
          fStack_1808 = auVar131._24_4_ + fVar99 * auVar79._24_4_;
          fStack_1804 = auVar131._28_4_ + auVar79._28_4_;
          auVar144._8_8_ = 0;
          auVar144._0_8_ = *(ulong *)(uVar56 + 0x50 + lVar57);
          auVar85 = vpmovzxbd_avx(auVar144);
          auVar162._8_8_ = 0;
          auVar162._0_8_ = *(ulong *)(uVar56 + 0x54 + lVar57);
          auVar75 = vpmovzxbd_avx(auVar162);
          auVar151._16_16_ = auVar75;
          auVar151._0_16_ = auVar85;
          fVar158 = *(float *)(uVar56 + 0x80 + lVar57);
          auVar79 = vcvtdq2ps_avx(auVar151);
          fVar94 = *(float *)(uVar56 + 0x74 + lVar57);
          auVar152._0_4_ = fVar94 + fVar158 * auVar79._0_4_;
          auVar152._4_4_ = fVar94 + fVar158 * auVar79._4_4_;
          auVar152._8_4_ = fVar94 + fVar158 * auVar79._8_4_;
          auVar152._12_4_ = fVar94 + fVar158 * auVar79._12_4_;
          auVar152._16_4_ = fVar94 + fVar158 * auVar79._16_4_;
          auVar152._20_4_ = fVar94 + fVar158 * auVar79._20_4_;
          auVar152._24_4_ = fVar94 + fVar158 * auVar79._24_4_;
          auVar152._28_4_ = fVar94 + auVar79._28_4_;
          auVar211._8_8_ = 0;
          auVar211._0_8_ = *(ulong *)(uVar56 + 0x98 + lVar57);
          auVar85 = vpmovzxbd_avx(auVar211);
          auVar230._8_8_ = 0;
          auVar230._0_8_ = *(ulong *)(uVar56 + 0x9c + lVar57);
          auVar75 = vpmovzxbd_avx(auVar230);
          auVar215._16_16_ = auVar75;
          auVar215._0_16_ = auVar85;
          fVar95 = *(float *)(uVar56 + 200 + lVar57);
          auVar79 = vcvtdq2ps_avx(auVar215);
          fVar96 = *(float *)(uVar56 + 0xbc + lVar57);
          auVar216._0_4_ = fVar96 + fVar95 * auVar79._0_4_;
          auVar216._4_4_ = fVar96 + fVar95 * auVar79._4_4_;
          auVar216._8_4_ = fVar96 + fVar95 * auVar79._8_4_;
          auVar216._12_4_ = fVar96 + fVar95 * auVar79._12_4_;
          auVar216._16_4_ = fVar96 + fVar95 * auVar79._16_4_;
          auVar216._20_4_ = fVar96 + fVar95 * auVar79._20_4_;
          auVar216._24_4_ = fVar96 + fVar95 * auVar79._24_4_;
          auVar216._28_4_ = fVar96 + auVar79._28_4_;
          auVar79 = vsubps_avx(auVar216,auVar152);
          auVar153._0_4_ = auVar79._0_4_ * fVar97 + auVar152._0_4_;
          auVar153._4_4_ = auVar79._4_4_ * fVar98 + auVar152._4_4_;
          auVar153._8_4_ = auVar79._8_4_ * fVar99 + auVar152._8_4_;
          auVar153._12_4_ = auVar79._12_4_ * fVar142 + auVar152._12_4_;
          auVar153._16_4_ = auVar79._16_4_ * fVar97 + auVar152._16_4_;
          auVar153._20_4_ = auVar79._20_4_ * fVar98 + auVar152._20_4_;
          auVar153._24_4_ = auVar79._24_4_ * fVar99 + auVar152._24_4_;
          auVar153._28_4_ = auVar79._28_4_ + auVar152._28_4_;
          auVar212._8_8_ = 0;
          auVar212._0_8_ = *(ulong *)(uVar56 + 0x58 + lVar57);
          auVar85 = vpmovzxbd_avx(auVar212);
          auVar265._8_8_ = 0;
          auVar265._0_8_ = *(ulong *)(uVar56 + 0x5c + lVar57);
          auVar75 = vpmovzxbd_avx(auVar265);
          auVar217._16_16_ = auVar75;
          auVar217._0_16_ = auVar85;
          auVar79 = vcvtdq2ps_avx(auVar217);
          auVar166._0_4_ = fVar94 + auVar79._0_4_ * fVar158;
          auVar166._4_4_ = fVar94 + auVar79._4_4_ * fVar158;
          auVar166._8_4_ = fVar94 + auVar79._8_4_ * fVar158;
          auVar166._12_4_ = fVar94 + auVar79._12_4_ * fVar158;
          auVar166._16_4_ = fVar94 + auVar79._16_4_ * fVar158;
          auVar166._20_4_ = fVar94 + auVar79._20_4_ * fVar158;
          auVar166._24_4_ = fVar94 + auVar79._24_4_ * fVar158;
          auVar166._28_4_ = fVar94 + fVar158;
          auVar185._8_8_ = 0;
          auVar185._0_8_ = *(ulong *)(uVar56 + 0xa0 + lVar57);
          auVar85 = vpmovzxbd_avx(auVar185);
          auVar213._8_8_ = 0;
          auVar213._0_8_ = *(ulong *)(uVar56 + 0xa4 + lVar57);
          auVar75 = vpmovzxbd_avx(auVar213);
          auVar192._16_16_ = auVar75;
          auVar192._0_16_ = auVar85;
          auVar79 = vcvtdq2ps_avx(auVar192);
          auVar193._0_4_ = fVar96 + fVar95 * auVar79._0_4_;
          auVar193._4_4_ = fVar96 + fVar95 * auVar79._4_4_;
          auVar193._8_4_ = fVar96 + fVar95 * auVar79._8_4_;
          auVar193._12_4_ = fVar96 + fVar95 * auVar79._12_4_;
          auVar193._16_4_ = fVar96 + fVar95 * auVar79._16_4_;
          auVar193._20_4_ = fVar96 + fVar95 * auVar79._20_4_;
          auVar193._24_4_ = fVar96 + fVar95 * auVar79._24_4_;
          auVar193._28_4_ = fVar96 + auVar79._28_4_;
          auVar79 = vsubps_avx(auVar193,auVar166);
          auVar167._0_4_ = auVar166._0_4_ + fVar97 * auVar79._0_4_;
          auVar167._4_4_ = auVar166._4_4_ + fVar98 * auVar79._4_4_;
          auVar167._8_4_ = auVar166._8_4_ + fVar99 * auVar79._8_4_;
          auVar167._12_4_ = auVar166._12_4_ + fVar142 * auVar79._12_4_;
          auVar167._16_4_ = auVar166._16_4_ + fVar97 * auVar79._16_4_;
          auVar167._20_4_ = auVar166._20_4_ + fVar98 * auVar79._20_4_;
          auVar167._24_4_ = auVar166._24_4_ + fVar99 * auVar79._24_4_;
          auVar167._28_4_ = auVar166._28_4_ + auVar79._28_4_;
          auVar186._8_8_ = 0;
          auVar186._0_8_ = *(ulong *)(uVar56 + 0x60 + lVar57);
          auVar85 = vpmovzxbd_avx(auVar186);
          auVar214._8_8_ = 0;
          auVar214._0_8_ = *(ulong *)(uVar56 + 100 + lVar57);
          auVar75 = vpmovzxbd_avx(auVar214);
          auVar194._16_16_ = auVar75;
          auVar194._0_16_ = auVar85;
          fVar158 = *(float *)(uVar56 + 0x84 + lVar57);
          fVar94 = *(float *)(uVar56 + 0x78 + lVar57);
          auVar79 = vcvtdq2ps_avx(auVar194);
          auVar195._0_4_ = fVar94 + fVar158 * auVar79._0_4_;
          auVar195._4_4_ = fVar94 + fVar158 * auVar79._4_4_;
          auVar195._8_4_ = fVar94 + fVar158 * auVar79._8_4_;
          auVar195._12_4_ = fVar94 + fVar158 * auVar79._12_4_;
          auVar195._16_4_ = fVar94 + fVar158 * auVar79._16_4_;
          auVar195._20_4_ = fVar94 + fVar158 * auVar79._20_4_;
          auVar195._24_4_ = fVar94 + fVar158 * auVar79._24_4_;
          auVar195._28_4_ = fVar94 + auVar79._28_4_;
          auVar246._8_8_ = 0;
          auVar246._0_8_ = *(ulong *)(uVar56 + 0xa8 + lVar57);
          auVar85 = vpmovzxbd_avx(auVar246);
          auVar266._8_8_ = 0;
          auVar266._0_8_ = *(ulong *)(uVar56 + 0xac + lVar57);
          auVar75 = vpmovzxbd_avx(auVar266);
          auVar249._16_16_ = auVar75;
          auVar249._0_16_ = auVar85;
          fVar95 = *(float *)(uVar56 + 0xcc + lVar57);
          fVar96 = *(float *)(uVar56 + 0xc0 + lVar57);
          auVar79 = vcvtdq2ps_avx(auVar249);
          auVar250._0_4_ = fVar96 + fVar95 * auVar79._0_4_;
          auVar250._4_4_ = fVar96 + fVar95 * auVar79._4_4_;
          auVar250._8_4_ = fVar96 + fVar95 * auVar79._8_4_;
          auVar250._12_4_ = fVar96 + fVar95 * auVar79._12_4_;
          auVar250._16_4_ = fVar96 + fVar95 * auVar79._16_4_;
          auVar250._20_4_ = fVar96 + fVar95 * auVar79._20_4_;
          auVar250._24_4_ = fVar96 + fVar95 * auVar79._24_4_;
          auVar250._28_4_ = fVar96 + auVar79._28_4_;
          auVar79 = vsubps_avx(auVar250,auVar195);
          auVar196._0_4_ = auVar79._0_4_ * fVar97 + auVar195._0_4_;
          auVar196._4_4_ = auVar79._4_4_ * fVar98 + auVar195._4_4_;
          auVar196._8_4_ = auVar79._8_4_ * fVar99 + auVar195._8_4_;
          auVar196._12_4_ = auVar79._12_4_ * fVar142 + auVar195._12_4_;
          auVar196._16_4_ = auVar79._16_4_ * fVar97 + auVar195._16_4_;
          auVar196._20_4_ = auVar79._20_4_ * fVar98 + auVar195._20_4_;
          auVar196._24_4_ = auVar79._24_4_ * fVar99 + auVar195._24_4_;
          auVar196._28_4_ = auVar79._28_4_ + auVar195._28_4_;
          auVar247._8_8_ = 0;
          auVar247._0_8_ = *(ulong *)(uVar56 + 0x68 + lVar57);
          auVar85 = vpmovzxbd_avx(auVar247);
          auVar280._8_8_ = 0;
          auVar280._0_8_ = *(ulong *)(uVar56 + 0x6c + lVar57);
          auVar75 = vpmovzxbd_avx(auVar280);
          auVar251._16_16_ = auVar75;
          auVar251._0_16_ = auVar85;
          auVar79 = vcvtdq2ps_avx(auVar251);
          auVar218._0_4_ = fVar94 + fVar158 * auVar79._0_4_;
          auVar218._4_4_ = fVar94 + fVar158 * auVar79._4_4_;
          auVar218._8_4_ = fVar94 + fVar158 * auVar79._8_4_;
          auVar218._12_4_ = fVar94 + fVar158 * auVar79._12_4_;
          auVar218._16_4_ = fVar94 + fVar158 * auVar79._16_4_;
          auVar218._20_4_ = fVar94 + fVar158 * auVar79._20_4_;
          auVar218._24_4_ = fVar94 + fVar158 * auVar79._24_4_;
          auVar218._28_4_ = fVar94 + fVar158;
          auVar231._8_8_ = 0;
          auVar231._0_8_ = *(ulong *)(uVar56 + 0xb0 + lVar57);
          auVar85 = vpmovzxbd_avx(auVar231);
          auVar248._8_8_ = 0;
          auVar248._0_8_ = *(ulong *)(uVar56 + 0xb4 + lVar57);
          auVar75 = vpmovzxbd_avx(auVar248);
          auVar232._16_16_ = auVar75;
          auVar232._0_16_ = auVar85;
          auVar79 = vcvtdq2ps_avx(auVar232);
          auVar233._0_4_ = fVar96 + fVar95 * auVar79._0_4_;
          auVar233._4_4_ = fVar96 + fVar95 * auVar79._4_4_;
          auVar233._8_4_ = fVar96 + fVar95 * auVar79._8_4_;
          auVar233._12_4_ = fVar96 + fVar95 * auVar79._12_4_;
          auVar233._16_4_ = fVar96 + fVar95 * auVar79._16_4_;
          auVar233._20_4_ = fVar96 + fVar95 * auVar79._20_4_;
          auVar233._24_4_ = fVar96 + fVar95 * auVar79._24_4_;
          auVar233._28_4_ = fVar96 + auVar79._28_4_;
          auVar79 = vsubps_avx(auVar233,auVar218);
          auVar219._0_4_ = auVar218._0_4_ + auVar79._0_4_ * fVar97;
          auVar219._4_4_ = auVar218._4_4_ + auVar79._4_4_ * fVar98;
          auVar219._8_4_ = auVar218._8_4_ + auVar79._8_4_ * fVar99;
          auVar219._12_4_ = auVar218._12_4_ + auVar79._12_4_ * fVar142;
          auVar219._16_4_ = auVar218._16_4_ + auVar79._16_4_ * fVar97;
          auVar219._20_4_ = auVar218._20_4_ + auVar79._20_4_ * fVar98;
          auVar219._24_4_ = auVar218._24_4_ + auVar79._24_4_ * fVar99;
          auVar219._28_4_ = auVar218._28_4_ + fVar142;
          auVar79 = vsubps_avx(auVar118,auVar301._0_32_);
          auVar101._0_4_ = auVar79._0_4_ * (float)local_15e0._0_4_;
          auVar101._4_4_ = auVar79._4_4_ * (float)local_15e0._4_4_;
          auVar101._8_4_ = auVar79._8_4_ * fStack_15d8;
          auVar101._12_4_ = auVar79._12_4_ * fStack_15d4;
          auVar89._16_4_ = auVar79._16_4_ * fStack_15d0;
          auVar89._0_16_ = auVar101;
          auVar89._20_4_ = auVar79._20_4_ * fStack_15cc;
          auVar89._24_4_ = auVar79._24_4_ * fStack_15c8;
          auVar89._28_4_ = auVar79._28_4_;
          auVar79 = vsubps_avx(auVar153,auVar170._0_32_);
          auVar113._0_4_ = auVar79._0_4_ * (float)local_1600._0_4_;
          auVar113._4_4_ = auVar79._4_4_ * (float)local_1600._4_4_;
          auVar113._8_4_ = auVar79._8_4_ * fStack_15f8;
          auVar113._12_4_ = auVar79._12_4_ * fStack_15f4;
          auVar10._16_4_ = auVar79._16_4_ * fStack_15f0;
          auVar10._0_16_ = auVar113;
          auVar10._20_4_ = auVar79._20_4_ * fStack_15ec;
          auVar10._24_4_ = auVar79._24_4_ * fStack_15e8;
          auVar10._28_4_ = auVar79._28_4_;
          auVar79 = vsubps_avx(auVar196,local_15c0);
          auVar145._0_4_ = auVar252._0_4_ * auVar79._0_4_;
          auVar145._4_4_ = auVar252._4_4_ * auVar79._4_4_;
          auVar145._8_4_ = auVar252._8_4_ * auVar79._8_4_;
          auVar145._12_4_ = auVar252._12_4_ * auVar79._12_4_;
          auVar11._16_4_ = auVar252._16_4_ * auVar79._16_4_;
          auVar11._0_16_ = auVar145;
          auVar11._20_4_ = auVar252._20_4_ * auVar79._20_4_;
          auVar11._24_4_ = auVar252._24_4_ * auVar79._24_4_;
          auVar11._28_4_ = auVar79._28_4_;
          auVar79 = vsubps_avx(_local_1820,auVar301._0_32_);
          auVar127._0_4_ = auVar269._0_4_ * auVar79._0_4_;
          auVar127._4_4_ = auVar269._4_4_ * auVar79._4_4_;
          auVar127._8_4_ = auVar269._8_4_ * auVar79._8_4_;
          auVar127._12_4_ = auVar269._12_4_ * auVar79._12_4_;
          auVar12._16_4_ = auVar269._16_4_ * auVar79._16_4_;
          auVar12._0_16_ = auVar127;
          auVar12._20_4_ = auVar269._20_4_ * auVar79._20_4_;
          auVar12._24_4_ = auVar269._24_4_ * auVar79._24_4_;
          auVar12._28_4_ = auVar79._28_4_;
          auVar79 = vsubps_avx(auVar167,auVar170._0_32_);
          auVar163._0_4_ = auVar273._0_4_ * auVar79._0_4_;
          auVar163._4_4_ = auVar273._4_4_ * auVar79._4_4_;
          auVar163._8_4_ = auVar273._8_4_ * auVar79._8_4_;
          auVar163._12_4_ = auVar273._12_4_ * auVar79._12_4_;
          auVar13._16_4_ = auVar273._16_4_ * auVar79._16_4_;
          auVar13._0_16_ = auVar163;
          auVar13._20_4_ = auVar273._20_4_ * auVar79._20_4_;
          auVar13._24_4_ = auVar273._24_4_ * auVar79._24_4_;
          auVar13._28_4_ = auVar79._28_4_;
          auVar79 = vsubps_avx(auVar219,local_15c0);
          auVar187._0_4_ = local_1580._0_4_ * auVar79._0_4_;
          auVar187._4_4_ = local_1580._4_4_ * auVar79._4_4_;
          auVar187._8_4_ = local_1580._8_4_ * auVar79._8_4_;
          auVar187._12_4_ = local_1580._12_4_ * auVar79._12_4_;
          auVar14._16_4_ = local_1580._16_4_ * auVar79._16_4_;
          auVar14._0_16_ = auVar187;
          auVar14._20_4_ = local_1580._20_4_ * auVar79._20_4_;
          auVar14._24_4_ = local_1580._24_4_ * auVar79._24_4_;
          auVar14._28_4_ = auVar79._28_4_;
          auVar75 = vpminsd_avx(auVar89._16_16_,auVar12._16_16_);
          auVar85 = vpmaxsd_avx(auVar89._16_16_,auVar12._16_16_);
          auVar126 = vpminsd_avx(auVar10._16_16_,auVar13._16_16_);
          auVar75 = vpmaxsd_avx(auVar75,auVar126);
          auVar126 = vpmaxsd_avx(auVar10._16_16_,auVar13._16_16_);
          auVar100 = vpminsd_avx(auVar85,auVar126);
          auVar126 = vpminsd_avx(auVar11._16_16_,auVar14._16_16_);
          auVar85 = vpmaxsd_avx(auVar11._16_16_,auVar14._16_16_);
          auVar126 = vpmaxsd_avx(auVar126,local_1460._0_16_);
          auVar75 = vpmaxsd_avx(auVar75,auVar126);
          auVar85 = vpminsd_avx(auVar85,local_1480._0_16_);
          auVar126 = vpminsd_avx(auVar100,auVar85);
          auVar85 = vpcmpeqd_avx(auVar273._0_16_,auVar273._0_16_);
          auVar100 = vpmovsxbd_avx(auVar85 ^ auVar147);
          auVar147 = vpcmpgtd_avx(auVar75,auVar126);
          auVar100 = vpor_avx(auVar147,auVar100);
          auVar147 = vpminsd_avx(auVar101,auVar127);
          auVar75 = vpminsd_avx(auVar113,auVar163);
          auVar147 = vpmaxsd_avx(auVar147,auVar75);
          auVar75 = vpminsd_avx(auVar145,auVar187);
          auVar75 = vpmaxsd_avx(auVar75,local_1620._0_16_);
          auVar147 = vpmaxsd_avx(auVar147,auVar75);
          auVar75 = vpmaxsd_avx(auVar101,auVar127);
          auVar126 = vpmaxsd_avx(auVar113,auVar163);
          auVar126 = vpminsd_avx(auVar75,auVar126);
          auVar75 = vpmaxsd_avx(auVar145,auVar187);
          auVar75 = vpminsd_avx(auVar75,local_15a0._0_16_);
          auVar122 = ZEXT1664(auVar75);
          auVar75 = vpminsd_avx(auVar126,auVar75);
          auVar147 = vpcmpgtd_avx(auVar147,auVar75);
          auVar106 = ZEXT1664(auVar147);
          auVar85 = vpmovsxbd_avx(auVar85 ^ local_17d0);
          auVar147 = vpor_avx(auVar147,auVar85);
          auVar80._16_16_ = auVar100;
          auVar80._0_16_ = auVar147;
          auVar79 = vcvtdq2ps_avx(auVar80);
          auVar90._8_4_ = 0xbf800000;
          auVar90._0_8_ = 0xbf800000bf800000;
          auVar90._12_4_ = 0xbf800000;
          auVar90._16_4_ = 0xbf800000;
          auVar90._20_4_ = 0xbf800000;
          auVar90._24_4_ = 0xbf800000;
          auVar90._28_4_ = 0xbf800000;
          auVar93 = ZEXT3264(auVar90);
          auVar79 = vcmpps_avx(auVar90,auVar79,1);
          uVar68 = vmovmskps_avx(auVar79);
          local_1720 = CONCAT44((int)((ulong)This >> 0x20),uVar68);
          auVar147 = ZEXT416(0) << 0x20;
          local_1730 = uVar56 + lVar57;
          while( true ) {
            auVar285 = ZEXT3264(local_15a0);
            auVar282 = ZEXT3264(local_1580);
            auVar135 = ZEXT1664(auVar147);
            if (local_1720 == 0) break;
            lVar57 = 0;
            if (local_1720 != 0) {
              for (; (local_1720 >> lVar57 & 1) == 0; lVar57 = lVar57 + 1) {
              }
            }
            uVar4 = *(ushort *)(local_1730 + lVar57 * 8);
            uVar5 = *(ushort *)(local_1730 + 2 + lVar57 * 8);
            uVar71 = CONCAT44(0,*(uint *)(local_1730 + 0xd8));
            local_1738 = (ulong)*(uint *)(local_1730 + 4 + lVar57 * 8);
            local_1708 = context->scene;
            local_17d0._0_8_ = uVar71;
            pGVar66 = (local_1708->geometries).items[uVar71].ptr;
            local_1710 = *(long *)&pGVar66->field_0x58;
            local_1718 = pGVar66[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                         _M_i * local_1738;
            fVar158 = (pGVar66->time_range).lower;
            fVar158 = pGVar66->fnumTimeSegments *
                      (((ray->dir).field_0.m128[3] - fVar158) /
                      ((pGVar66->time_range).upper - fVar158));
            auVar85 = vroundss_avx(ZEXT416((uint)fVar158),ZEXT416((uint)fVar158),9);
            auVar85 = vminss_avx(auVar85,ZEXT416((uint)(pGVar66->fnumTimeSegments + -1.0)));
            auVar77 = vmaxss_avx(auVar147,auVar85);
            local_1830 = uVar4 & 0x7fff;
            local_1834 = uVar5 & 0x7fff;
            uVar61 = *(uint *)(local_1710 + 4 + local_1718);
            uVar62 = (ulong)uVar61;
            uVar67 = (ulong)(uVar61 * local_1834 + *(int *)(local_1710 + local_1718) + local_1830);
            lVar6 = *(long *)&pGVar66[2].numPrimitives;
            lVar63 = (long)(int)auVar77._0_4_ * 0x38;
            lVar7 = *(long *)(lVar6 + 0x10 + lVar63);
            lVar8 = *(long *)(lVar6 + lVar63);
            auVar147 = *(undefined1 (*) [16])(lVar8 + lVar7 * uVar67);
            lVar9 = *(long *)(lVar6 + 0x48 + lVar63);
            auVar85 = *(undefined1 (*) [16])(lVar8 + (uVar67 + 1) * lVar7);
            lVar57 = uVar67 + uVar62;
            auVar75 = *(undefined1 (*) [16])(lVar8 + lVar57 * lVar7);
            lVar65 = uVar67 + uVar62 + 1;
            auVar126 = *(undefined1 (*) [16])(lVar8 + lVar65 * lVar7);
            uVar59 = (ulong)(-1 < (short)uVar4);
            lVar58 = uVar67 + uVar59 + 1;
            auVar100 = *(undefined1 (*) [16])(lVar8 + lVar58 * lVar7);
            lVar64 = uVar59 + lVar65;
            auVar110 = *(undefined1 (*) [16])(lVar8 + lVar64 * lVar7);
            uVar59 = 0;
            if (-1 < (short)uVar5) {
              uVar59 = uVar62;
            }
            auVar76 = *(undefined1 (*) [16])(lVar8 + (lVar57 + uVar59) * lVar7);
            auVar86 = *(undefined1 (*) [16])(lVar8 + (lVar65 + uVar59) * lVar7);
            auVar101 = *(undefined1 (*) [16])(lVar8 + lVar7 * (uVar59 + lVar64));
            lVar6 = *(long *)(lVar6 + 0x38 + lVar63);
            auVar77 = ZEXT416((uint)(fVar158 - auVar77._0_4_));
            auVar77 = vshufps_avx(auVar77,auVar77,0);
            auVar111 = vsubps_avx(*(undefined1 (*) [16])(lVar6 + lVar9 * uVar67),auVar147);
            fVar158 = auVar77._0_4_;
            fVar94 = auVar77._4_4_;
            fVar95 = auVar77._8_4_;
            fVar96 = auVar77._12_4_;
            auVar267._0_4_ = auVar111._0_4_ * fVar158 + auVar147._0_4_;
            auVar267._4_4_ = auVar111._4_4_ * fVar94 + auVar147._4_4_;
            auVar267._8_4_ = auVar111._8_4_ * fVar95 + auVar147._8_4_;
            auVar267._12_4_ = auVar111._12_4_ * fVar96 + auVar147._12_4_;
            auVar147 = vsubps_avx(*(undefined1 (*) [16])(lVar6 + lVar9 * (uVar67 + 1)),auVar85);
            auVar102._0_4_ = auVar147._0_4_ * fVar158 + auVar85._0_4_;
            auVar102._4_4_ = auVar147._4_4_ * fVar94 + auVar85._4_4_;
            auVar102._8_4_ = auVar147._8_4_ * fVar95 + auVar85._8_4_;
            auVar102._12_4_ = auVar147._12_4_ * fVar96 + auVar85._12_4_;
            auVar147 = vsubps_avx(*(undefined1 (*) [16])(lVar6 + lVar9 * lVar57),auVar75);
            auVar128._0_4_ = auVar147._0_4_ * fVar158 + auVar75._0_4_;
            auVar128._4_4_ = auVar147._4_4_ * fVar94 + auVar75._4_4_;
            auVar128._8_4_ = auVar147._8_4_ * fVar95 + auVar75._8_4_;
            auVar128._12_4_ = auVar147._12_4_ * fVar96 + auVar75._12_4_;
            auVar147 = vsubps_avx(*(undefined1 (*) [16])(lVar6 + lVar9 * lVar65),auVar126);
            auVar87._0_4_ = auVar147._0_4_ * fVar158 + auVar126._0_4_;
            auVar87._4_4_ = auVar147._4_4_ * fVar94 + auVar126._4_4_;
            auVar87._8_4_ = auVar147._8_4_ * fVar95 + auVar126._8_4_;
            auVar87._12_4_ = auVar147._12_4_ * fVar96 + auVar126._12_4_;
            auVar147 = vsubps_avx(*(undefined1 (*) [16])(lVar6 + lVar9 * lVar58),auVar100);
            auVar164._0_4_ = auVar147._0_4_ * fVar158 + auVar100._0_4_;
            auVar164._4_4_ = auVar147._4_4_ * fVar94 + auVar100._4_4_;
            auVar164._8_4_ = auVar147._8_4_ * fVar95 + auVar100._8_4_;
            auVar164._12_4_ = auVar147._12_4_ * fVar96 + auVar100._12_4_;
            auVar147 = vsubps_avx(*(undefined1 (*) [16])(lVar6 + lVar9 * lVar64),auVar110);
            auVar146._0_4_ = auVar110._0_4_ + fVar158 * auVar147._0_4_;
            auVar146._4_4_ = auVar110._4_4_ + fVar94 * auVar147._4_4_;
            auVar146._8_4_ = auVar110._8_4_ + fVar95 * auVar147._8_4_;
            auVar146._12_4_ = auVar110._12_4_ + fVar96 * auVar147._12_4_;
            auVar147 = vsubps_avx(*(undefined1 (*) [16])(lVar6 + lVar9 * (lVar57 + uVar59)),auVar76)
            ;
            auVar114._0_4_ = auVar76._0_4_ + fVar158 * auVar147._0_4_;
            auVar114._4_4_ = auVar76._4_4_ + fVar94 * auVar147._4_4_;
            auVar114._8_4_ = auVar76._8_4_ + fVar95 * auVar147._8_4_;
            auVar114._12_4_ = auVar76._12_4_ + fVar96 * auVar147._12_4_;
            auVar147 = vsubps_avx(*(undefined1 (*) [16])(lVar6 + lVar9 * (lVar65 + uVar59)),auVar86)
            ;
            auVar188._0_4_ = auVar86._0_4_ + fVar158 * auVar147._0_4_;
            auVar188._4_4_ = auVar86._4_4_ + fVar94 * auVar147._4_4_;
            auVar188._8_4_ = auVar86._8_4_ + fVar95 * auVar147._8_4_;
            auVar188._12_4_ = auVar86._12_4_ + fVar96 * auVar147._12_4_;
            auVar147 = vsubps_avx(*(undefined1 (*) [16])(lVar6 + (uVar59 + lVar64) * lVar9),auVar101
                                 );
            auVar78._0_4_ = auVar101._0_4_ + auVar147._0_4_ * fVar158;
            auVar78._4_4_ = auVar101._4_4_ + auVar147._4_4_ * fVar94;
            auVar78._8_4_ = auVar101._8_4_ + auVar147._8_4_ * fVar95;
            auVar78._12_4_ = auVar101._12_4_ + auVar147._12_4_ * fVar96;
            auVar75 = vunpcklps_avx(auVar267,auVar87);
            auVar147 = vunpckhps_avx(auVar267,auVar87);
            auVar126 = vunpcklps_avx(auVar102,auVar128);
            auVar85 = vunpckhps_avx(auVar102,auVar128);
            auVar110 = vunpcklps_avx(auVar147,auVar85);
            auVar77 = vunpcklps_avx(auVar75,auVar126);
            auVar147 = vunpckhps_avx(auVar75,auVar126);
            auVar126 = vunpcklps_avx(auVar102,auVar146);
            auVar85 = vunpckhps_avx(auVar102,auVar146);
            auVar100 = vunpcklps_avx(auVar164,auVar87);
            auVar75 = vunpckhps_avx(auVar164,auVar87);
            auVar76 = vunpcklps_avx(auVar85,auVar75);
            auVar86 = vunpcklps_avx(auVar126,auVar100);
            auVar85 = vunpckhps_avx(auVar126,auVar100);
            auVar100 = vunpcklps_avx(auVar87,auVar78);
            auVar75 = vunpckhps_avx(auVar87,auVar78);
            auVar101 = vunpcklps_avx(auVar146,auVar188);
            auVar126 = vunpckhps_avx(auVar146,auVar188);
            auVar111 = vunpcklps_avx(auVar75,auVar126);
            auVar112 = vunpcklps_avx(auVar100,auVar101);
            auVar75 = vunpckhps_avx(auVar100,auVar101);
            auVar101 = vunpcklps_avx(auVar128,auVar188);
            auVar126 = vunpckhps_avx(auVar128,auVar188);
            auVar113 = vunpcklps_avx(auVar87,auVar114);
            auVar100 = vunpckhps_avx(auVar87,auVar114);
            auVar100 = vunpcklps_avx(auVar126,auVar100);
            auVar127 = vunpcklps_avx(auVar101,auVar113);
            auVar126 = vunpckhps_avx(auVar101,auVar113);
            auVar154._16_16_ = auVar112;
            auVar154._0_16_ = auVar77;
            auVar197._16_16_ = auVar75;
            auVar197._0_16_ = auVar147;
            auVar81._16_16_ = auVar111;
            auVar81._0_16_ = auVar110;
            auVar168._16_16_ = auVar86;
            auVar168._0_16_ = auVar86;
            auVar220._16_16_ = auVar85;
            auVar220._0_16_ = auVar85;
            auVar234._16_16_ = auVar76;
            auVar234._0_16_ = auVar76;
            auVar119._16_16_ = auVar127;
            auVar119._0_16_ = auVar127;
            auVar300._16_16_ = auVar126;
            auVar300._0_16_ = auVar126;
            auVar268._16_16_ = auVar100;
            auVar268._0_16_ = auVar100;
            uVar68 = *(undefined4 *)&(local_1848->org).field_0;
            auVar132._4_4_ = uVar68;
            auVar132._0_4_ = uVar68;
            auVar132._8_4_ = uVar68;
            auVar132._12_4_ = uVar68;
            auVar132._16_4_ = uVar68;
            auVar132._20_4_ = uVar68;
            auVar132._24_4_ = uVar68;
            auVar132._28_4_ = uVar68;
            uVar68 = *(undefined4 *)((long)&(local_1848->org).field_0 + 4);
            auVar272._4_4_ = uVar68;
            auVar272._0_4_ = uVar68;
            auVar272._8_4_ = uVar68;
            auVar272._12_4_ = uVar68;
            auVar272._16_4_ = uVar68;
            auVar272._20_4_ = uVar68;
            auVar272._24_4_ = uVar68;
            auVar272._28_4_ = uVar68;
            uVar68 = *(undefined4 *)((long)&(local_1848->org).field_0 + 8);
            auVar281._4_4_ = uVar68;
            auVar281._0_4_ = uVar68;
            auVar281._8_4_ = uVar68;
            auVar281._12_4_ = uVar68;
            auVar281._16_4_ = uVar68;
            auVar281._20_4_ = uVar68;
            auVar281._24_4_ = uVar68;
            auVar281._28_4_ = uVar68;
            local_1640 = vsubps_avx(auVar154,auVar132);
            local_1660 = vsubps_avx(auVar197,auVar272);
            local_1680 = vsubps_avx(auVar81,auVar281);
            auVar79 = vsubps_avx(auVar168,auVar132);
            auVar89 = vsubps_avx(auVar220,auVar272);
            auVar10 = vsubps_avx(auVar234,auVar281);
            auVar11 = vsubps_avx(auVar119,auVar132);
            auVar12 = vsubps_avx(auVar300,auVar272);
            auVar13 = vsubps_avx(auVar268,auVar281);
            local_16a0 = vsubps_avx(auVar11,local_1640);
            local_1380 = vsubps_avx(auVar12,local_1660);
            local_13a0 = vsubps_avx(auVar13,local_1680);
            fVar94 = local_1660._0_4_;
            fVar158 = auVar12._0_4_ + fVar94;
            fVar95 = local_1660._4_4_;
            fVar171 = auVar12._4_4_ + fVar95;
            fVar96 = local_1660._8_4_;
            fVar173 = auVar12._8_4_ + fVar96;
            fVar97 = local_1660._12_4_;
            fVar175 = auVar12._12_4_ + fVar97;
            fVar98 = local_1660._16_4_;
            fVar177 = auVar12._16_4_ + fVar98;
            fVar99 = local_1660._20_4_;
            fVar179 = auVar12._20_4_ + fVar99;
            fVar142 = local_1660._24_4_;
            fVar181 = auVar12._24_4_ + fVar142;
            fVar125 = local_1660._28_4_;
            fVar283 = local_1680._0_4_;
            fVar183 = fVar283 + auVar13._0_4_;
            fVar286 = local_1680._4_4_;
            fVar201 = fVar286 + auVar13._4_4_;
            fVar288 = local_1680._8_4_;
            fVar202 = fVar288 + auVar13._8_4_;
            fVar290 = local_1680._12_4_;
            fVar203 = fVar290 + auVar13._12_4_;
            fVar292 = local_1680._16_4_;
            fVar204 = fVar292 + auVar13._16_4_;
            fVar294 = local_1680._20_4_;
            fVar205 = fVar294 + auVar13._20_4_;
            fVar296 = local_1680._24_4_;
            fVar207 = fVar296 + auVar13._24_4_;
            fVar136 = local_1680._28_4_;
            fVar107 = local_13a0._0_4_;
            fVar108 = local_13a0._4_4_;
            auVar21._4_4_ = fVar108 * fVar171;
            auVar21._0_4_ = fVar107 * fVar158;
            fVar109 = local_13a0._8_4_;
            auVar21._8_4_ = fVar109 * fVar173;
            fVar83 = local_13a0._12_4_;
            auVar21._12_4_ = fVar83 * fVar175;
            fVar84 = local_13a0._16_4_;
            auVar21._16_4_ = fVar84 * fVar177;
            fVar123 = local_13a0._20_4_;
            auVar21._20_4_ = fVar123 * fVar179;
            fVar124 = local_13a0._24_4_;
            auVar21._24_4_ = fVar124 * fVar181;
            auVar21._28_4_ = auVar76._12_4_;
            fVar298 = local_1380._0_4_;
            fVar302 = local_1380._4_4_;
            auVar22._4_4_ = fVar302 * fVar201;
            auVar22._0_4_ = fVar298 * fVar183;
            fVar304 = local_1380._8_4_;
            auVar22._8_4_ = fVar304 * fVar202;
            fVar306 = local_1380._12_4_;
            auVar22._12_4_ = fVar306 * fVar203;
            fVar308 = local_1380._16_4_;
            auVar22._16_4_ = fVar308 * fVar204;
            fVar310 = local_1380._20_4_;
            auVar22._20_4_ = fVar310 * fVar205;
            fVar312 = local_1380._24_4_;
            auVar22._24_4_ = fVar312 * fVar207;
            auVar22._28_4_ = auVar100._12_4_;
            auVar14 = vsubps_avx(auVar22,auVar21);
            fVar244 = local_1640._0_4_;
            fVar229 = fVar244 + auVar11._0_4_;
            fVar253 = local_1640._4_4_;
            fVar237 = fVar253 + auVar11._4_4_;
            fVar255 = local_1640._8_4_;
            fVar238 = fVar255 + auVar11._8_4_;
            fVar257 = local_1640._12_4_;
            fVar239 = fVar257 + auVar11._12_4_;
            fVar259 = local_1640._16_4_;
            fVar240 = fVar259 + auVar11._16_4_;
            fVar261 = local_1640._20_4_;
            fVar241 = fVar261 + auVar11._20_4_;
            fVar263 = local_1640._24_4_;
            fVar242 = fVar263 + auVar11._24_4_;
            fVar243 = local_1640._28_4_ + auVar11._28_4_;
            fVar270 = local_16a0._0_4_;
            fVar274 = local_16a0._4_4_;
            auVar23._4_4_ = fVar274 * fVar201;
            auVar23._0_4_ = fVar270 * fVar183;
            fVar275 = local_16a0._8_4_;
            auVar23._8_4_ = fVar275 * fVar202;
            fVar276 = local_16a0._12_4_;
            auVar23._12_4_ = fVar276 * fVar203;
            fVar277 = local_16a0._16_4_;
            auVar23._16_4_ = fVar277 * fVar204;
            fVar278 = local_16a0._20_4_;
            auVar23._20_4_ = fVar278 * fVar205;
            fVar279 = local_16a0._24_4_;
            auVar23._24_4_ = fVar279 * fVar207;
            auVar23._28_4_ = fVar136 + auVar13._28_4_;
            auVar24._4_4_ = fVar237 * fVar108;
            auVar24._0_4_ = fVar229 * fVar107;
            auVar24._8_4_ = fVar238 * fVar109;
            auVar24._12_4_ = fVar239 * fVar83;
            auVar24._16_4_ = fVar240 * fVar84;
            auVar24._20_4_ = fVar241 * fVar123;
            auVar24._24_4_ = fVar242 * fVar124;
            auVar24._28_4_ = auVar100._12_4_;
            auVar80 = vsubps_avx(auVar24,auVar23);
            auVar25._4_4_ = fVar302 * fVar237;
            auVar25._0_4_ = fVar298 * fVar229;
            auVar25._8_4_ = fVar304 * fVar238;
            auVar25._12_4_ = fVar306 * fVar239;
            auVar25._16_4_ = fVar308 * fVar240;
            auVar25._20_4_ = fVar310 * fVar241;
            auVar25._24_4_ = fVar312 * fVar242;
            auVar25._28_4_ = fVar243;
            auVar26._4_4_ = fVar274 * fVar171;
            auVar26._0_4_ = fVar270 * fVar158;
            auVar26._8_4_ = fVar275 * fVar173;
            auVar26._12_4_ = fVar276 * fVar175;
            auVar26._16_4_ = fVar277 * fVar177;
            auVar26._20_4_ = fVar278 * fVar179;
            auVar26._24_4_ = fVar279 * fVar181;
            auVar26._28_4_ = auVar12._28_4_ + fVar125;
            auVar90 = vsubps_avx(auVar26,auVar25);
            fVar158 = (local_1848->dir).field_0.m128[1];
            auVar271._4_4_ = fVar158;
            auVar271._0_4_ = fVar158;
            auVar271._8_4_ = fVar158;
            auVar271._12_4_ = fVar158;
            local_1800._16_4_ = fVar158;
            local_1800._0_16_ = auVar271;
            local_1800._20_4_ = fVar158;
            local_1800._24_4_ = fVar158;
            local_1800._28_4_ = fVar158;
            local_1820._4_4_ = (local_1848->dir).field_0.m128[2];
            local_1780._4_4_ = (local_1848->dir).field_0.m128[0];
            local_1780._0_4_ = local_1780._4_4_;
            fStack_1778 = (float)local_1780._4_4_;
            fStack_1774 = (float)local_1780._4_4_;
            fStack_1770 = (float)local_1780._4_4_;
            fStack_176c = (float)local_1780._4_4_;
            fStack_1768 = (float)local_1780._4_4_;
            fStack_1764 = (float)local_1780._4_4_;
            local_17c0._0_4_ =
                 (float)local_1780._4_4_ * auVar14._0_4_ +
                 fVar158 * auVar80._0_4_ + (float)local_1820._4_4_ * auVar90._0_4_;
            local_17c0._4_4_ =
                 (float)local_1780._4_4_ * auVar14._4_4_ +
                 fVar158 * auVar80._4_4_ + (float)local_1820._4_4_ * auVar90._4_4_;
            local_17c0._8_4_ =
                 (float)local_1780._4_4_ * auVar14._8_4_ +
                 fVar158 * auVar80._8_4_ + (float)local_1820._4_4_ * auVar90._8_4_;
            local_17c0._12_4_ =
                 (float)local_1780._4_4_ * auVar14._12_4_ +
                 fVar158 * auVar80._12_4_ + (float)local_1820._4_4_ * auVar90._12_4_;
            local_17c0._16_4_ =
                 (float)local_1780._4_4_ * auVar14._16_4_ +
                 fVar158 * auVar80._16_4_ + (float)local_1820._4_4_ * auVar90._16_4_;
            local_17c0._20_4_ =
                 (float)local_1780._4_4_ * auVar14._20_4_ +
                 fVar158 * auVar80._20_4_ + (float)local_1820._4_4_ * auVar90._20_4_;
            local_17c0._24_4_ =
                 (float)local_1780._4_4_ * auVar14._24_4_ +
                 fVar158 * auVar80._24_4_ + (float)local_1820._4_4_ * auVar90._24_4_;
            local_17c0._28_4_ = auVar80._28_4_ + auVar80._28_4_ + auVar90._28_4_;
            local_13c0 = vsubps_avx(local_1660,auVar89);
            auVar14 = vsubps_avx(local_1680,auVar10);
            fVar175 = fVar94 + auVar89._0_4_;
            fVar179 = fVar95 + auVar89._4_4_;
            fVar183 = fVar96 + auVar89._8_4_;
            fVar202 = fVar97 + auVar89._12_4_;
            fVar204 = fVar98 + auVar89._16_4_;
            fVar207 = fVar99 + auVar89._20_4_;
            fVar237 = fVar142 + auVar89._24_4_;
            fVar171 = auVar89._28_4_;
            fVar238 = fVar283 + auVar10._0_4_;
            fVar239 = fVar286 + auVar10._4_4_;
            fVar240 = fVar288 + auVar10._8_4_;
            fVar241 = fVar290 + auVar10._12_4_;
            fVar242 = fVar292 + auVar10._16_4_;
            fVar206 = fVar294 + auVar10._20_4_;
            fVar208 = fVar296 + auVar10._24_4_;
            fVar299 = auVar14._0_4_;
            fVar303 = auVar14._4_4_;
            auVar27._4_4_ = fVar303 * fVar179;
            auVar27._0_4_ = fVar299 * fVar175;
            fVar305 = auVar14._8_4_;
            auVar27._8_4_ = fVar305 * fVar183;
            fVar307 = auVar14._12_4_;
            auVar27._12_4_ = fVar307 * fVar202;
            fVar309 = auVar14._16_4_;
            auVar27._16_4_ = fVar309 * fVar204;
            fVar311 = auVar14._20_4_;
            auVar27._20_4_ = fVar311 * fVar207;
            fVar313 = auVar14._24_4_;
            auVar27._24_4_ = fVar313 * fVar237;
            auVar27._28_4_ = fVar136;
            fVar173 = local_13c0._0_4_;
            fVar177 = local_13c0._4_4_;
            auVar28._4_4_ = fVar177 * fVar239;
            auVar28._0_4_ = fVar173 * fVar238;
            fVar181 = local_13c0._8_4_;
            auVar28._8_4_ = fVar181 * fVar240;
            fVar201 = local_13c0._12_4_;
            auVar28._12_4_ = fVar201 * fVar241;
            fVar203 = local_13c0._16_4_;
            auVar28._16_4_ = fVar203 * fVar242;
            fVar205 = local_13c0._20_4_;
            auVar28._20_4_ = fVar205 * fVar206;
            fVar229 = local_13c0._24_4_;
            auVar28._24_4_ = fVar229 * fVar208;
            auVar28._28_4_ = fVar125;
            auVar14 = vsubps_avx(auVar28,auVar27);
            auVar80 = vsubps_avx(local_1640,auVar79);
            fVar284 = auVar80._0_4_;
            fVar287 = auVar80._4_4_;
            auVar29._4_4_ = fVar287 * fVar239;
            auVar29._0_4_ = fVar284 * fVar238;
            fVar289 = auVar80._8_4_;
            auVar29._8_4_ = fVar289 * fVar240;
            fVar291 = auVar80._12_4_;
            auVar29._12_4_ = fVar291 * fVar241;
            fVar293 = auVar80._16_4_;
            auVar29._16_4_ = fVar293 * fVar242;
            fVar295 = auVar80._20_4_;
            auVar29._20_4_ = fVar295 * fVar206;
            fVar297 = auVar80._24_4_;
            auVar29._24_4_ = fVar297 * fVar208;
            auVar29._28_4_ = fVar136 + auVar10._28_4_;
            fVar238 = fVar244 + auVar79._0_4_;
            fVar239 = fVar253 + auVar79._4_4_;
            fVar240 = fVar255 + auVar79._8_4_;
            fVar241 = fVar257 + auVar79._12_4_;
            fVar242 = fVar259 + auVar79._16_4_;
            fVar206 = fVar261 + auVar79._20_4_;
            fVar208 = fVar263 + auVar79._24_4_;
            auVar30._4_4_ = fVar303 * fVar239;
            auVar30._0_4_ = fVar299 * fVar238;
            auVar30._8_4_ = fVar305 * fVar240;
            auVar30._12_4_ = fVar307 * fVar241;
            auVar30._16_4_ = fVar309 * fVar242;
            auVar30._20_4_ = fVar311 * fVar206;
            auVar30._24_4_ = fVar313 * fVar208;
            auVar30._28_4_ = fVar243;
            auVar80 = vsubps_avx(auVar30,auVar29);
            auVar117 = local_13c0;
            auVar31._4_4_ = fVar239 * fVar177;
            auVar31._0_4_ = fVar238 * fVar173;
            auVar31._8_4_ = fVar240 * fVar181;
            auVar31._12_4_ = fVar241 * fVar201;
            auVar31._16_4_ = fVar242 * fVar203;
            auVar31._20_4_ = fVar206 * fVar205;
            auVar31._24_4_ = fVar208 * fVar229;
            auVar31._28_4_ = fVar243;
            auVar32._4_4_ = fVar287 * fVar179;
            auVar32._0_4_ = fVar284 * fVar175;
            auVar32._8_4_ = fVar289 * fVar183;
            auVar32._12_4_ = fVar291 * fVar202;
            auVar32._16_4_ = fVar293 * fVar204;
            auVar32._20_4_ = fVar295 * fVar207;
            auVar32._24_4_ = fVar297 * fVar237;
            auVar32._28_4_ = fVar125 + fVar171;
            auVar90 = vsubps_avx(auVar32,auVar31);
            fVar125 = auVar14._28_4_;
            local_13e0._0_4_ =
                 (float)local_1780._4_4_ * auVar14._0_4_ +
                 fVar158 * auVar80._0_4_ + (float)local_1820._4_4_ * auVar90._0_4_;
            local_13e0._4_4_ =
                 (float)local_1780._4_4_ * auVar14._4_4_ +
                 fVar158 * auVar80._4_4_ + (float)local_1820._4_4_ * auVar90._4_4_;
            local_13e0._8_4_ =
                 (float)local_1780._4_4_ * auVar14._8_4_ +
                 fVar158 * auVar80._8_4_ + (float)local_1820._4_4_ * auVar90._8_4_;
            local_13e0._12_4_ =
                 (float)local_1780._4_4_ * auVar14._12_4_ +
                 fVar158 * auVar80._12_4_ + (float)local_1820._4_4_ * auVar90._12_4_;
            local_13e0._16_4_ =
                 (float)local_1780._4_4_ * auVar14._16_4_ +
                 fVar158 * auVar80._16_4_ + (float)local_1820._4_4_ * auVar90._16_4_;
            local_13e0._20_4_ =
                 (float)local_1780._4_4_ * auVar14._20_4_ +
                 fVar158 * auVar80._20_4_ + (float)local_1820._4_4_ * auVar90._20_4_;
            local_13e0._24_4_ =
                 (float)local_1780._4_4_ * auVar14._24_4_ +
                 fVar158 * auVar80._24_4_ + (float)local_1820._4_4_ * auVar90._24_4_;
            local_13e0._28_4_ = fVar125 + auVar80._28_4_ + auVar90._28_4_;
            local_17a0 = vsubps_avx(auVar79,auVar11);
            fVar243 = auVar79._0_4_ + auVar11._0_4_;
            fVar136 = auVar79._4_4_ + auVar11._4_4_;
            fVar137 = auVar79._8_4_ + auVar11._8_4_;
            fVar138 = auVar79._12_4_ + auVar11._12_4_;
            fVar139 = auVar79._16_4_ + auVar11._16_4_;
            fVar140 = auVar79._20_4_ + auVar11._20_4_;
            fVar141 = auVar79._24_4_ + auVar11._24_4_;
            auVar14 = vsubps_avx(auVar89,auVar12);
            fVar238 = auVar89._0_4_ + auVar12._0_4_;
            fVar239 = auVar89._4_4_ + auVar12._4_4_;
            fVar240 = auVar89._8_4_ + auVar12._8_4_;
            fVar241 = auVar89._12_4_ + auVar12._12_4_;
            fVar242 = auVar89._16_4_ + auVar12._16_4_;
            fVar206 = auVar89._20_4_ + auVar12._20_4_;
            fVar208 = auVar89._24_4_ + auVar12._24_4_;
            auVar89 = vsubps_avx(auVar10,auVar13);
            fVar175 = auVar10._0_4_ + auVar13._0_4_;
            fVar179 = auVar10._4_4_ + auVar13._4_4_;
            fVar183 = auVar10._8_4_ + auVar13._8_4_;
            fVar202 = auVar10._12_4_ + auVar13._12_4_;
            fVar204 = auVar10._16_4_ + auVar13._16_4_;
            fVar207 = auVar10._20_4_ + auVar13._20_4_;
            fVar237 = auVar10._24_4_ + auVar13._24_4_;
            fVar159 = auVar89._0_4_;
            fVar172 = auVar89._4_4_;
            auVar33._4_4_ = fVar172 * fVar239;
            auVar33._0_4_ = fVar159 * fVar238;
            fVar174 = auVar89._8_4_;
            auVar33._8_4_ = fVar174 * fVar240;
            fVar176 = auVar89._12_4_;
            auVar33._12_4_ = fVar176 * fVar241;
            fVar178 = auVar89._16_4_;
            auVar33._16_4_ = fVar178 * fVar242;
            fVar180 = auVar89._20_4_;
            auVar33._20_4_ = fVar180 * fVar206;
            fVar182 = auVar89._24_4_;
            auVar33._24_4_ = fVar182 * fVar208;
            auVar33._28_4_ = fVar171;
            fVar245 = auVar14._0_4_;
            fVar254 = auVar14._4_4_;
            auVar34._4_4_ = fVar254 * fVar179;
            auVar34._0_4_ = fVar245 * fVar175;
            fVar256 = auVar14._8_4_;
            auVar34._8_4_ = fVar256 * fVar183;
            fVar258 = auVar14._12_4_;
            auVar34._12_4_ = fVar258 * fVar202;
            fVar260 = auVar14._16_4_;
            auVar34._16_4_ = fVar260 * fVar204;
            fVar262 = auVar14._20_4_;
            auVar34._20_4_ = fVar262 * fVar207;
            fVar264 = auVar14._24_4_;
            auVar34._24_4_ = fVar264 * fVar237;
            auVar34._28_4_ = fVar125;
            auVar89 = vsubps_avx(auVar34,auVar33);
            fVar209 = local_17a0._0_4_;
            fVar224 = local_17a0._4_4_;
            auVar35._4_4_ = fVar224 * fVar179;
            auVar35._0_4_ = fVar209 * fVar175;
            fVar225 = local_17a0._8_4_;
            auVar35._8_4_ = fVar225 * fVar183;
            fVar226 = local_17a0._12_4_;
            auVar35._12_4_ = fVar226 * fVar202;
            fVar227 = local_17a0._16_4_;
            auVar35._16_4_ = fVar227 * fVar204;
            fVar228 = local_17a0._20_4_;
            auVar35._20_4_ = fVar228 * fVar207;
            fVar207 = local_17a0._24_4_;
            auVar35._24_4_ = fVar207 * fVar237;
            auVar35._28_4_ = auVar10._28_4_ + auVar13._28_4_;
            auVar36._4_4_ = fVar172 * fVar136;
            auVar36._0_4_ = fVar159 * fVar243;
            auVar36._8_4_ = fVar174 * fVar137;
            auVar36._12_4_ = fVar176 * fVar138;
            auVar36._16_4_ = fVar178 * fVar139;
            auVar36._20_4_ = fVar180 * fVar140;
            auVar36._24_4_ = fVar182 * fVar141;
            auVar36._28_4_ = fVar125;
            auVar10 = vsubps_avx(auVar36,auVar35);
            auVar37._4_4_ = fVar254 * fVar136;
            auVar37._0_4_ = fVar245 * fVar243;
            auVar37._8_4_ = fVar256 * fVar137;
            auVar37._12_4_ = fVar258 * fVar138;
            auVar37._16_4_ = fVar260 * fVar139;
            auVar37._20_4_ = fVar262 * fVar140;
            auVar37._24_4_ = fVar264 * fVar141;
            auVar37._28_4_ = auVar79._28_4_ + auVar11._28_4_;
            auVar38._4_4_ = fVar224 * fVar239;
            auVar38._0_4_ = fVar209 * fVar238;
            auVar38._8_4_ = fVar225 * fVar240;
            auVar38._12_4_ = fVar226 * fVar241;
            auVar38._16_4_ = fVar227 * fVar242;
            auVar38._20_4_ = fVar228 * fVar206;
            auVar38._24_4_ = fVar207 * fVar208;
            auVar38._28_4_ = fVar171 + auVar12._28_4_;
            auVar79 = vsubps_avx(auVar38,auVar37);
            local_1820._0_4_ = local_1820._4_4_;
            fStack_1818 = (float)local_1820._4_4_;
            fStack_1814 = (float)local_1820._4_4_;
            fStack_1810 = (float)local_1820._4_4_;
            fStack_180c = (float)local_1820._4_4_;
            fStack_1808 = (float)local_1820._4_4_;
            fStack_1804 = (float)local_1820._4_4_;
            auVar91._0_4_ =
                 (float)local_1780._4_4_ * auVar89._0_4_ +
                 fVar158 * auVar10._0_4_ + (float)local_1820._4_4_ * auVar79._0_4_;
            auVar91._4_4_ =
                 (float)local_1780._4_4_ * auVar89._4_4_ +
                 fVar158 * auVar10._4_4_ + (float)local_1820._4_4_ * auVar79._4_4_;
            auVar91._8_4_ =
                 (float)local_1780._4_4_ * auVar89._8_4_ +
                 fVar158 * auVar10._8_4_ + (float)local_1820._4_4_ * auVar79._8_4_;
            auVar91._12_4_ =
                 (float)local_1780._4_4_ * auVar89._12_4_ +
                 fVar158 * auVar10._12_4_ + (float)local_1820._4_4_ * auVar79._12_4_;
            auVar91._16_4_ =
                 (float)local_1780._4_4_ * auVar89._16_4_ +
                 fVar158 * auVar10._16_4_ + (float)local_1820._4_4_ * auVar79._16_4_;
            auVar91._20_4_ =
                 (float)local_1780._4_4_ * auVar89._20_4_ +
                 fVar158 * auVar10._20_4_ + (float)local_1820._4_4_ * auVar79._20_4_;
            auVar91._24_4_ =
                 (float)local_1780._4_4_ * auVar89._24_4_ +
                 fVar158 * auVar10._24_4_ + (float)local_1820._4_4_ * auVar79._24_4_;
            auVar91._28_4_ = auVar79._28_4_ + auVar10._28_4_ + auVar79._28_4_;
            local_1400._0_4_ = auVar91._0_4_ + local_17c0._0_4_ + local_13e0._0_4_;
            local_1400._4_4_ = auVar91._4_4_ + local_17c0._4_4_ + local_13e0._4_4_;
            local_1400._8_4_ = auVar91._8_4_ + local_17c0._8_4_ + local_13e0._8_4_;
            local_1400._12_4_ = auVar91._12_4_ + local_17c0._12_4_ + local_13e0._12_4_;
            local_1400._16_4_ = auVar91._16_4_ + local_17c0._16_4_ + local_13e0._16_4_;
            local_1400._20_4_ = auVar91._20_4_ + local_17c0._20_4_ + local_13e0._20_4_;
            local_1400._24_4_ = auVar91._24_4_ + local_17c0._24_4_ + local_13e0._24_4_;
            local_1400._28_4_ = auVar91._28_4_ + local_17c0._28_4_ + local_13e0._28_4_;
            auVar79 = vminps_avx(local_17c0,local_13e0);
            auVar79 = vminps_avx(auVar79,auVar91);
            auVar133._8_4_ = 0x7fffffff;
            auVar133._0_8_ = 0x7fffffff7fffffff;
            auVar133._12_4_ = 0x7fffffff;
            auVar133._16_4_ = 0x7fffffff;
            auVar133._20_4_ = 0x7fffffff;
            auVar133._24_4_ = 0x7fffffff;
            auVar133._28_4_ = 0x7fffffff;
            local_14c0 = vandps_avx(local_1400,auVar133);
            fVar125 = local_14c0._0_4_ * 1.1920929e-07;
            fVar171 = local_14c0._4_4_ * 1.1920929e-07;
            auVar39._4_4_ = fVar171;
            auVar39._0_4_ = fVar125;
            fVar175 = local_14c0._8_4_ * 1.1920929e-07;
            auVar39._8_4_ = fVar175;
            fVar179 = local_14c0._12_4_ * 1.1920929e-07;
            auVar39._12_4_ = fVar179;
            fVar183 = local_14c0._16_4_ * 1.1920929e-07;
            auVar39._16_4_ = fVar183;
            fVar202 = local_14c0._20_4_ * 1.1920929e-07;
            auVar39._20_4_ = fVar202;
            fVar204 = local_14c0._24_4_ * 1.1920929e-07;
            auVar39._24_4_ = fVar204;
            auVar39._28_4_ = 0x34000000;
            auVar155._0_8_ = CONCAT44(fVar171,fVar125) ^ 0x8000000080000000;
            auVar155._8_4_ = -fVar175;
            auVar155._12_4_ = -fVar179;
            auVar155._16_4_ = -fVar183;
            auVar155._20_4_ = -fVar202;
            auVar155._24_4_ = -fVar204;
            auVar155._28_4_ = 0xb4000000;
            auVar79 = vcmpps_avx(auVar79,auVar155,5);
            auVar122 = ZEXT3264(auVar79);
            auVar10 = vmaxps_avx(local_17c0,local_13e0);
            auVar89 = vmaxps_avx(auVar10,auVar91);
            auVar89 = vcmpps_avx(auVar89,auVar39,2);
            local_1420 = vorps_avx(auVar79,auVar89);
            auVar106 = ZEXT3264(local_1420);
            auVar93 = ZEXT3264(local_1560);
            auVar89 = local_1560 & local_1420;
            if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar89 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar89 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar89 >> 0x7f,0) != '\0') ||
                  (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar89 >> 0xbf,0) != '\0') ||
                (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar89[0x1f] < '\0') {
              auVar40._4_4_ = fVar108 * fVar177;
              auVar40._0_4_ = fVar107 * fVar173;
              auVar40._8_4_ = fVar109 * fVar181;
              auVar40._12_4_ = fVar83 * fVar201;
              auVar40._16_4_ = fVar84 * fVar203;
              auVar40._20_4_ = fVar123 * fVar205;
              auVar40._24_4_ = fVar124 * fVar229;
              auVar40._28_4_ = local_1560._28_4_;
              auVar41._4_4_ = fVar303 * fVar302;
              auVar41._0_4_ = fVar299 * fVar298;
              auVar41._8_4_ = fVar305 * fVar304;
              auVar41._12_4_ = fVar307 * fVar306;
              auVar41._16_4_ = fVar309 * fVar308;
              auVar41._20_4_ = fVar311 * fVar310;
              auVar41._24_4_ = fVar313 * fVar312;
              auVar41._28_4_ = auVar79._28_4_;
              auVar11 = vsubps_avx(auVar41,auVar40);
              auVar42._4_4_ = fVar303 * fVar254;
              auVar42._0_4_ = fVar299 * fVar245;
              auVar42._8_4_ = fVar305 * fVar256;
              auVar42._12_4_ = fVar307 * fVar258;
              auVar42._16_4_ = fVar309 * fVar260;
              auVar42._20_4_ = fVar311 * fVar262;
              auVar42._24_4_ = fVar313 * fVar264;
              auVar42._28_4_ = 0x34000000;
              auVar43._4_4_ = fVar177 * fVar172;
              auVar43._0_4_ = fVar173 * fVar159;
              auVar43._8_4_ = fVar181 * fVar174;
              auVar43._12_4_ = fVar201 * fVar176;
              auVar43._16_4_ = fVar203 * fVar178;
              auVar43._20_4_ = fVar205 * fVar180;
              auVar43._24_4_ = fVar229 * fVar182;
              auVar43._28_4_ = auVar10._28_4_;
              auVar12 = vsubps_avx(auVar43,auVar42);
              auVar235._8_4_ = 0x7fffffff;
              auVar235._0_8_ = 0x7fffffff7fffffff;
              auVar235._12_4_ = 0x7fffffff;
              auVar235._16_4_ = 0x7fffffff;
              auVar235._20_4_ = 0x7fffffff;
              auVar235._24_4_ = 0x7fffffff;
              auVar235._28_4_ = 0x7fffffff;
              auVar79 = vandps_avx(auVar235,auVar40);
              auVar89 = vandps_avx(auVar235,auVar42);
              auVar79 = vcmpps_avx(auVar79,auVar89,1);
              auVar10 = vblendvps_avx(auVar12,auVar11,auVar79);
              auVar93 = ZEXT3264(auVar10);
              auVar44._4_4_ = fVar287 * fVar172;
              auVar44._0_4_ = fVar284 * fVar159;
              auVar44._8_4_ = fVar289 * fVar174;
              auVar44._12_4_ = fVar291 * fVar176;
              auVar44._16_4_ = fVar293 * fVar178;
              auVar44._20_4_ = fVar295 * fVar180;
              auVar44._24_4_ = fVar297 * fVar182;
              auVar44._28_4_ = auVar11._28_4_;
              auVar45._4_4_ = fVar108 * fVar287;
              auVar45._0_4_ = fVar107 * fVar284;
              auVar45._8_4_ = fVar109 * fVar289;
              auVar45._12_4_ = fVar83 * fVar291;
              auVar45._16_4_ = fVar84 * fVar293;
              auVar45._20_4_ = fVar123 * fVar295;
              auVar45._24_4_ = fVar124 * fVar297;
              auVar45._28_4_ = auVar89._28_4_;
              auVar46._4_4_ = fVar274 * fVar303;
              auVar46._0_4_ = fVar270 * fVar299;
              auVar46._8_4_ = fVar275 * fVar305;
              auVar46._12_4_ = fVar276 * fVar307;
              auVar46._16_4_ = fVar277 * fVar309;
              auVar46._20_4_ = fVar278 * fVar311;
              auVar46._24_4_ = fVar279 * fVar313;
              auVar46._28_4_ = auVar12._28_4_;
              auVar12 = vsubps_avx(auVar45,auVar46);
              auVar47._4_4_ = fVar303 * fVar224;
              auVar47._0_4_ = fVar299 * fVar209;
              auVar47._8_4_ = fVar305 * fVar225;
              auVar47._12_4_ = fVar307 * fVar226;
              auVar47._16_4_ = fVar309 * fVar227;
              auVar47._20_4_ = fVar311 * fVar228;
              auVar47._24_4_ = fVar313 * fVar207;
              auVar47._28_4_ = local_17a0._28_4_;
              auVar11 = vsubps_avx(auVar47,auVar44);
              auVar79 = vandps_avx(auVar235,auVar46);
              auVar89 = vandps_avx(auVar235,auVar44);
              auVar89 = vcmpps_avx(auVar79,auVar89,1);
              auVar11 = vblendvps_avx(auVar11,auVar12,auVar89);
              auVar48._4_4_ = fVar177 * fVar224;
              auVar48._0_4_ = fVar173 * fVar209;
              auVar48._8_4_ = fVar181 * fVar225;
              auVar48._12_4_ = fVar201 * fVar226;
              auVar48._16_4_ = fVar203 * fVar227;
              auVar48._20_4_ = fVar205 * fVar228;
              auVar48._24_4_ = fVar229 * fVar207;
              auVar48._28_4_ = auVar89._28_4_;
              auVar49._4_4_ = fVar274 * fVar177;
              auVar49._0_4_ = fVar270 * fVar173;
              auVar49._8_4_ = fVar275 * fVar181;
              auVar49._12_4_ = fVar276 * fVar201;
              auVar49._16_4_ = fVar277 * fVar203;
              auVar49._20_4_ = fVar278 * fVar205;
              auVar49._24_4_ = fVar279 * fVar229;
              auVar49._28_4_ = auVar12._28_4_;
              auVar50._4_4_ = fVar287 * fVar302;
              auVar50._0_4_ = fVar284 * fVar298;
              auVar50._8_4_ = fVar289 * fVar304;
              auVar50._12_4_ = fVar291 * fVar306;
              auVar50._16_4_ = fVar293 * fVar308;
              auVar50._20_4_ = fVar295 * fVar310;
              auVar50._24_4_ = fVar297 * fVar312;
              auVar50._28_4_ = auVar79._28_4_;
              auVar51._4_4_ = fVar287 * fVar254;
              auVar51._0_4_ = fVar284 * fVar245;
              auVar51._8_4_ = fVar289 * fVar256;
              auVar51._12_4_ = fVar291 * fVar258;
              auVar51._16_4_ = fVar293 * fVar260;
              auVar51._20_4_ = fVar295 * fVar262;
              auVar51._24_4_ = fVar297 * fVar264;
              auVar51._28_4_ = local_13c0._28_4_;
              auVar13 = vsubps_avx(auVar49,auVar50);
              auVar14 = vsubps_avx(auVar51,auVar48);
              auVar79 = vandps_avx(auVar235,auVar50);
              auVar89 = vandps_avx(auVar235,auVar48);
              auVar12 = vcmpps_avx(auVar79,auVar89,1);
              auVar89 = vblendvps_avx(auVar14,auVar13,auVar12);
              auVar106 = ZEXT3264(auVar89);
              fVar181 = auVar89._0_4_;
              fVar183 = auVar89._4_4_;
              fVar83 = auVar89._8_4_;
              fVar201 = auVar89._12_4_;
              fVar202 = auVar89._16_4_;
              fVar84 = auVar89._20_4_;
              fVar203 = auVar89._24_4_;
              fVar237 = auVar11._0_4_;
              fVar238 = auVar11._4_4_;
              fVar239 = auVar11._8_4_;
              fVar240 = auVar11._12_4_;
              fVar241 = auVar11._16_4_;
              fVar242 = auVar11._20_4_;
              fVar179 = auVar13._28_4_;
              fVar206 = auVar11._24_4_;
              fVar125 = auVar10._0_4_;
              fVar171 = auVar10._4_4_;
              fVar107 = auVar10._8_4_;
              fVar173 = auVar10._12_4_;
              fVar175 = auVar10._16_4_;
              fVar108 = auVar10._20_4_;
              fVar177 = auVar10._24_4_;
              fVar109 = (float)local_1780._4_4_ * fVar125 +
                        fVar237 * fVar158 + fVar181 * (float)local_1820._4_4_;
              fVar204 = (float)local_1780._4_4_ * fVar171 +
                        fVar238 * fVar158 + fVar183 * (float)local_1820._4_4_;
              fVar123 = (float)local_1780._4_4_ * fVar107 +
                        fVar239 * fVar158 + fVar83 * (float)local_1820._4_4_;
              fVar205 = (float)local_1780._4_4_ * fVar173 +
                        fVar240 * fVar158 + fVar201 * (float)local_1820._4_4_;
              fVar207 = (float)local_1780._4_4_ * fVar175 +
                        fVar241 * fVar158 + fVar202 * (float)local_1820._4_4_;
              fVar124 = (float)local_1780._4_4_ * fVar108 +
                        fVar242 * fVar158 + fVar84 * (float)local_1820._4_4_;
              fVar158 = (float)local_1780._4_4_ * fVar177 +
                        fVar206 * fVar158 + fVar203 * (float)local_1820._4_4_;
              fVar229 = fVar179 + fVar179 + auVar12._28_4_;
              auVar120._0_4_ = fVar109 + fVar109;
              auVar120._4_4_ = fVar204 + fVar204;
              auVar120._8_4_ = fVar123 + fVar123;
              auVar120._12_4_ = fVar205 + fVar205;
              auVar120._16_4_ = fVar207 + fVar207;
              auVar120._20_4_ = fVar124 + fVar124;
              auVar120._24_4_ = fVar158 + fVar158;
              auVar120._28_4_ = fVar229 + fVar229;
              fVar109 = auVar79._28_4_;
              auVar79 = vrcpps_avx(auVar120);
              fVar204 = fVar125 * fVar244 + fVar237 * fVar94 + fVar181 * fVar283;
              fVar123 = fVar171 * fVar253 + fVar238 * fVar95 + fVar183 * fVar286;
              fVar205 = fVar107 * fVar255 + fVar239 * fVar96 + fVar83 * fVar288;
              fVar207 = fVar173 * fVar257 + fVar240 * fVar97 + fVar201 * fVar290;
              fVar124 = fVar175 * fVar259 + fVar241 * fVar98 + fVar202 * fVar292;
              fVar229 = fVar108 * fVar261 + fVar242 * fVar99 + fVar84 * fVar294;
              fVar142 = fVar177 * fVar263 + fVar206 * fVar142 + fVar203 * fVar296;
              fVar179 = fVar109 + fVar109 + fVar179;
              fVar158 = auVar79._0_4_;
              fVar94 = auVar79._4_4_;
              auVar52._4_4_ = auVar120._4_4_ * fVar94;
              auVar52._0_4_ = auVar120._0_4_ * fVar158;
              fVar95 = auVar79._8_4_;
              auVar52._8_4_ = auVar120._8_4_ * fVar95;
              fVar96 = auVar79._12_4_;
              auVar52._12_4_ = auVar120._12_4_ * fVar96;
              fVar97 = auVar79._16_4_;
              auVar52._16_4_ = auVar120._16_4_ * fVar97;
              fVar98 = auVar79._20_4_;
              auVar52._20_4_ = auVar120._20_4_ * fVar98;
              fVar99 = auVar79._24_4_;
              auVar52._24_4_ = auVar120._24_4_ * fVar99;
              auVar52._28_4_ = fVar109;
              auVar221._8_4_ = 0x3f800000;
              auVar221._0_8_ = 0x3f8000003f800000;
              auVar221._12_4_ = 0x3f800000;
              auVar221._16_4_ = 0x3f800000;
              auVar221._20_4_ = 0x3f800000;
              auVar221._24_4_ = 0x3f800000;
              auVar221._28_4_ = 0x3f800000;
              auVar79 = vsubps_avx(auVar221,auVar52);
              uVar68 = *(undefined4 *)((long)&(local_1848->org).field_0 + 0xc);
              auVar198._4_4_ = uVar68;
              auVar198._0_4_ = uVar68;
              auVar198._8_4_ = uVar68;
              auVar198._12_4_ = uVar68;
              auVar198._16_4_ = uVar68;
              auVar198._20_4_ = uVar68;
              auVar198._24_4_ = uVar68;
              auVar198._28_4_ = uVar68;
              local_1280._4_4_ = (fVar123 + fVar123) * (fVar94 + fVar94 * auVar79._4_4_);
              local_1280._0_4_ = (fVar204 + fVar204) * (fVar158 + fVar158 * auVar79._0_4_);
              local_1280._8_4_ = (fVar205 + fVar205) * (fVar95 + fVar95 * auVar79._8_4_);
              local_1280._12_4_ = (fVar207 + fVar207) * (fVar96 + fVar96 * auVar79._12_4_);
              local_1280._16_4_ = (fVar124 + fVar124) * (fVar97 + fVar97 * auVar79._16_4_);
              local_1280._20_4_ = (fVar229 + fVar229) * (fVar98 + fVar98 * auVar79._20_4_);
              local_1280._24_4_ = (fVar142 + fVar142) * (fVar99 + fVar99 * auVar79._24_4_);
              local_1280._28_4_ = fVar179 + fVar179;
              auVar79 = vcmpps_avx(auVar198,local_1280,2);
              fVar158 = local_1848->tfar;
              auVar199._4_4_ = fVar158;
              auVar199._0_4_ = fVar158;
              auVar199._8_4_ = fVar158;
              auVar199._12_4_ = fVar158;
              auVar199._16_4_ = fVar158;
              auVar199._20_4_ = fVar158;
              auVar199._24_4_ = fVar158;
              auVar199._28_4_ = fVar158;
              auVar89 = vcmpps_avx(local_1280,auVar199,2);
              auVar79 = vandps_avx(auVar79,auVar89);
              auVar89 = vcmpps_avx(auVar120,_DAT_01f7b000,4);
              auVar79 = vandps_avx(auVar89,auVar79);
              auVar147 = vpslld_avx(auVar79._0_16_,0x1f);
              auVar85 = vpsrad_avx(auVar147,0x1f);
              auVar147 = vpslld_avx(auVar79._16_16_,0x1f);
              auVar147 = vpsrad_avx(auVar147,0x1f);
              auVar121._16_16_ = auVar147;
              auVar121._0_16_ = auVar85;
              auVar122 = ZEXT3264(auVar121);
              auVar79 = vandps_avx(local_1420,local_1560);
              auVar89 = auVar79 & auVar121;
              if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar89 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar89 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar89 >> 0x7f,0) != '\0') ||
                    (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar89 >> 0xbf,0) != '\0') ||
                  (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar89[0x1f] < '\0') {
                local_1780._0_4_ = local_1848->tfar;
                local_1780._4_4_ = local_1848->mask;
                fStack_1778 = (float)local_1848->id;
                fStack_1774 = (float)local_1848->flags;
                local_12e0 = vandps_avx(auVar121,auVar79);
                auVar122 = ZEXT3264(local_12e0);
                uVar61 = vextractps_avx(_local_1780,1);
                local_1320 = local_1400;
                local_1300 = &local_1849;
                auVar79 = vsubps_avx(local_1400,local_13e0);
                auVar79 = vblendvps_avx(local_17c0,auVar79,local_1440);
                auVar89 = vsubps_avx(local_1400,local_17c0);
                auVar89 = vblendvps_avx(local_13e0,auVar89,local_1440);
                auVar169._8_4_ = 0xbf800000;
                auVar169._0_8_ = 0xbf800000bf800000;
                auVar169._12_4_ = 0xbf800000;
                auVar169._16_4_ = 0xbf800000;
                auVar169._20_4_ = 0xbf800000;
                auVar169._24_4_ = 0xbf800000;
                auVar169._28_4_ = 0xbf800000;
                auVar222._8_4_ = 0x3f800000;
                auVar222._0_8_ = 0x3f8000003f800000;
                auVar222._12_4_ = 0x3f800000;
                auVar222._16_4_ = 0x3f800000;
                auVar222._20_4_ = 0x3f800000;
                auVar222._24_4_ = 0x3f800000;
                auVar222._28_4_ = 0x3f800000;
                auVar11 = vblendvps_avx(auVar222,auVar169,local_1440);
                fVar158 = auVar11._0_4_;
                fVar94 = auVar11._4_4_;
                fVar95 = auVar11._8_4_;
                fVar96 = auVar11._12_4_;
                fVar97 = auVar11._16_4_;
                fVar98 = auVar11._20_4_;
                uStack_1244 = auVar10._28_4_;
                fVar99 = auVar11._24_4_;
                local_1260[0] = fVar158 * fVar125;
                local_1260[1] = fVar94 * fVar171;
                local_1260[2] = fVar95 * fVar107;
                local_1260[3] = fVar96 * fVar173;
                fStack_1250 = fVar97 * fVar175;
                fStack_124c = fVar98 * fVar108;
                fStack_1248 = fVar99 * fVar177;
                local_1240[0] = fVar237 * fVar158;
                local_1240[1] = fVar238 * fVar94;
                local_1240[2] = fVar239 * fVar95;
                local_1240[3] = fVar240 * fVar96;
                fStack_1230 = fVar241 * fVar97;
                fStack_122c = fVar242 * fVar98;
                fStack_1228 = fVar206 * fVar99;
                uStack_1224 = uStack_1244;
                local_1220[0] = fVar158 * fVar181;
                local_1220[1] = fVar94 * fVar183;
                local_1220[2] = fVar95 * fVar83;
                local_1220[3] = fVar96 * fVar201;
                fStack_1210 = fVar97 * fVar202;
                fStack_120c = fVar98 * fVar84;
                fStack_1208 = fVar99 * fVar203;
                uStack_1204 = uStack_1244;
                auVar147 = vpshufd_avx(ZEXT416(local_1830),0);
                auVar147 = vpaddd_avx(auVar147,_DAT_01f76ad0);
                auVar85 = vpshufd_avx(ZEXT416(local_1834),0);
                auVar85 = vpaddd_avx(auVar85,_DAT_01f76ae0);
                auVar165._0_4_ = (float)(int)(*(ushort *)(local_1710 + 8 + local_1718) - 1);
                auVar165._4_12_ = auVar271._4_12_;
                auVar75 = vrcpss_avx(auVar165,auVar165);
                auVar189._0_4_ = (float)(int)(*(ushort *)(local_1710 + 10 + local_1718) - 1);
                auVar189._4_12_ = auVar271._4_12_;
                auVar126 = vrcpss_avx(auVar189,auVar189);
                auVar92._16_16_ = auVar147;
                auVar92._0_16_ = auVar147;
                auVar10 = vcvtdq2ps_avx(auVar92);
                fVar142 = auVar10._28_4_ + auVar79._28_4_;
                auVar147 = ZEXT416((uint)(auVar75._0_4_ * (2.0 - auVar75._0_4_ * auVar165._0_4_)));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                fVar158 = (local_1400._0_4_ * auVar10._0_4_ + auVar79._0_4_) * auVar147._0_4_;
                fVar94 = (local_1400._4_4_ * auVar10._4_4_ + auVar79._4_4_) * auVar147._4_4_;
                local_1360._4_4_ = fVar94;
                local_1360._0_4_ = fVar158;
                fVar95 = (local_1400._8_4_ * auVar10._8_4_ + auVar79._8_4_) * auVar147._8_4_;
                local_1360._8_4_ = fVar95;
                fVar96 = (local_1400._12_4_ * auVar10._12_4_ + auVar79._12_4_) * auVar147._12_4_;
                local_1360._12_4_ = fVar96;
                fVar97 = (local_1400._16_4_ * auVar10._16_4_ + auVar79._16_4_) * auVar147._0_4_;
                local_1360._16_4_ = fVar97;
                fVar98 = (local_1400._20_4_ * auVar10._20_4_ + auVar79._20_4_) * auVar147._4_4_;
                local_1360._20_4_ = fVar98;
                fVar99 = (local_1400._24_4_ * auVar10._24_4_ + auVar79._24_4_) * auVar147._8_4_;
                local_1360._24_4_ = fVar99;
                local_1360._28_4_ = fVar142;
                auVar93 = ZEXT3264(local_1360);
                auVar105._16_16_ = auVar85;
                auVar105._0_16_ = auVar85;
                auVar79 = vcvtdq2ps_avx(auVar105);
                auVar147 = ZEXT416((uint)(auVar126._0_4_ * (2.0 - auVar126._0_4_ * auVar189._0_4_)))
                ;
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                fVar125 = (local_1400._0_4_ * auVar79._0_4_ + auVar89._0_4_) * auVar147._0_4_;
                fVar171 = (local_1400._4_4_ * auVar79._4_4_ + auVar89._4_4_) * auVar147._4_4_;
                local_1340._4_4_ = fVar171;
                local_1340._0_4_ = fVar125;
                fVar107 = (local_1400._8_4_ * auVar79._8_4_ + auVar89._8_4_) * auVar147._8_4_;
                local_1340._8_4_ = fVar107;
                fVar173 = (local_1400._12_4_ * auVar79._12_4_ + auVar89._12_4_) * auVar147._12_4_;
                local_1340._12_4_ = fVar173;
                fVar175 = (local_1400._16_4_ * auVar79._16_4_ + auVar89._16_4_) * auVar147._0_4_;
                local_1340._16_4_ = fVar175;
                fVar108 = (local_1400._20_4_ * auVar79._20_4_ + auVar89._20_4_) * auVar147._4_4_;
                local_1340._20_4_ = fVar108;
                fVar177 = (local_1400._24_4_ * auVar79._24_4_ + auVar89._24_4_) * auVar147._8_4_;
                local_1340._24_4_ = fVar177;
                local_1340._28_4_ = auVar79._28_4_ + auVar89._28_4_;
                auVar106 = ZEXT3264(local_1340);
                pGVar66 = (local_1708->geometries).items[uVar71].ptr;
                if ((pGVar66->mask & uVar61) != 0) {
                  pRVar69 = local_1840->args;
                  if ((pRVar69->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar66->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00e84980:
                    local_1848->tfar = -INFINITY;
                    return;
                  }
                  auVar79 = vrcpps_avx(local_1400);
                  fVar179 = auVar79._0_4_;
                  fVar109 = auVar79._4_4_;
                  auVar53._4_4_ = local_1400._4_4_ * fVar109;
                  auVar53._0_4_ = local_1400._0_4_ * fVar179;
                  fVar181 = auVar79._8_4_;
                  auVar53._8_4_ = local_1400._8_4_ * fVar181;
                  fVar183 = auVar79._12_4_;
                  auVar53._12_4_ = local_1400._12_4_ * fVar183;
                  fVar83 = auVar79._16_4_;
                  auVar53._16_4_ = local_1400._16_4_ * fVar83;
                  fVar201 = auVar79._20_4_;
                  auVar53._20_4_ = local_1400._20_4_ * fVar201;
                  fVar202 = auVar79._24_4_;
                  auVar53._24_4_ = local_1400._24_4_ * fVar202;
                  auVar53._28_4_ = local_1400._28_4_;
                  auVar156._8_4_ = 0x3f800000;
                  auVar156._0_8_ = 0x3f8000003f800000;
                  auVar156._12_4_ = 0x3f800000;
                  auVar156._16_4_ = 0x3f800000;
                  auVar156._20_4_ = 0x3f800000;
                  auVar156._24_4_ = 0x3f800000;
                  auVar156._28_4_ = 0x3f800000;
                  auVar89 = vsubps_avx(auVar156,auVar53);
                  auVar82._0_4_ = fVar179 + fVar179 * auVar89._0_4_;
                  auVar82._4_4_ = fVar109 + fVar109 * auVar89._4_4_;
                  auVar82._8_4_ = fVar181 + fVar181 * auVar89._8_4_;
                  auVar82._12_4_ = fVar183 + fVar183 * auVar89._12_4_;
                  auVar82._16_4_ = fVar83 + fVar83 * auVar89._16_4_;
                  auVar82._20_4_ = fVar201 + fVar201 * auVar89._20_4_;
                  auVar82._24_4_ = fVar202 + fVar202 * auVar89._24_4_;
                  auVar82._28_4_ = auVar79._28_4_ + auVar89._28_4_;
                  auVar134._8_4_ = 0x219392ef;
                  auVar134._0_8_ = 0x219392ef219392ef;
                  auVar134._12_4_ = 0x219392ef;
                  auVar134._16_4_ = 0x219392ef;
                  auVar134._20_4_ = 0x219392ef;
                  auVar134._24_4_ = 0x219392ef;
                  auVar134._28_4_ = 0x219392ef;
                  auVar79 = vcmpps_avx(local_14c0,auVar134,5);
                  auVar79 = vandps_avx(auVar79,auVar82);
                  auVar54._4_4_ = fVar94 * auVar79._4_4_;
                  auVar54._0_4_ = fVar158 * auVar79._0_4_;
                  auVar54._8_4_ = fVar95 * auVar79._8_4_;
                  auVar54._12_4_ = fVar96 * auVar79._12_4_;
                  auVar54._16_4_ = fVar97 * auVar79._16_4_;
                  auVar54._20_4_ = fVar98 * auVar79._20_4_;
                  auVar54._24_4_ = fVar99 * auVar79._24_4_;
                  auVar54._28_4_ = fVar142;
                  local_12c0 = vminps_avx(auVar54,auVar156);
                  auVar93 = ZEXT3264(local_12c0);
                  auVar55._4_4_ = fVar171 * auVar79._4_4_;
                  auVar55._0_4_ = fVar125 * auVar79._0_4_;
                  auVar55._8_4_ = fVar107 * auVar79._8_4_;
                  auVar55._12_4_ = fVar173 * auVar79._12_4_;
                  auVar55._16_4_ = fVar175 * auVar79._16_4_;
                  auVar55._20_4_ = fVar108 * auVar79._20_4_;
                  auVar55._24_4_ = fVar177 * auVar79._24_4_;
                  auVar55._28_4_ = auVar79._28_4_;
                  local_12a0 = vminps_avx(auVar55,auVar156);
                  uVar68 = vmovmskps_avx(local_12e0);
                  uVar59 = CONCAT44((int)((ulong)local_1840 >> 0x20),uVar68);
                  lVar57 = 0;
                  if (uVar59 != 0) {
                    for (; (uVar59 >> lVar57 & 1) == 0; lVar57 = lVar57 + 1) {
                    }
                  }
                  local_17a0._0_8_ = pRVar69;
                  local_17c0._0_8_ = pGVar66;
                  local_13c0 = auVar117;
                  while (uVar59 != 0) {
                    local_1800._0_8_ = uVar59;
                    local_16f4 = *(undefined4 *)(local_12c0 + lVar57 * 4);
                    local_16f0 = *(undefined4 *)(local_12a0 + lVar57 * 4);
                    local_1848->tfar = local_1260[lVar57 + -8];
                    local_16d0.context = local_1840->user;
                    local_1700 = local_1260[lVar57];
                    auVar147 = ZEXT416((uint)local_1700);
                    local_16fc = local_1240[lVar57];
                    auVar85 = ZEXT416((uint)local_16fc);
                    local_1820 = (undefined1  [8])lVar57;
                    local_16f8 = local_1220[lVar57];
                    local_16ec = (undefined4)local_1738;
                    local_16e8 = local_17d0._0_4_;
                    local_16e4 = (local_16d0.context)->instID[0];
                    local_16e0 = (local_16d0.context)->instPrimID[0];
                    local_182c = -1;
                    local_16d0.valid = &local_182c;
                    local_16d0.geometryUserPtr = pGVar66->userPtr;
                    local_16d0.ray = (RTCRayN *)local_1848;
                    local_16d0.hit = (RTCHitN *)&local_1700;
                    local_16d0.N = 1;
                    if (pGVar66->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e8483d:
                      if ((pRVar69->filter == (RTCFilterFunctionN)0x0) ||
                         (((pRVar69->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          ((*(byte *)(local_17c0._0_8_ + 0x3e) & 0x40) == 0)))) goto LAB_00e84980;
                      auVar106 = ZEXT1664(auVar147);
                      auVar122 = ZEXT1664(auVar85);
                      (*pRVar69->filter)(&local_16d0);
                      auVar93._8_56_ = extraout_var_00;
                      auVar93._0_8_ = extraout_XMM1_Qa_00;
                      if (*local_16d0.valid != 0) goto LAB_00e84980;
                    }
                    else {
                      auVar106 = ZEXT464((uint)local_1700);
                      auVar122 = ZEXT464((uint)local_16fc);
                      (*pGVar66->occlusionFilterN)(&local_16d0);
                      auVar85 = auVar122._0_16_;
                      auVar147 = auVar106._0_16_;
                      auVar93._8_56_ = extraout_var;
                      auVar93._0_8_ = extraout_XMM1_Qa;
                      pRVar69 = (RTCIntersectArguments *)local_17a0._0_8_;
                      if (*local_16d0.valid != 0) goto LAB_00e8483d;
                    }
                    local_1848->tfar = (float)local_1780._0_4_;
                    uVar59 = local_1800._0_8_ ^ 1L << ((ulong)local_1820 & 0x3f);
                    lVar57 = 0;
                    if (uVar59 != 0) {
                      for (; (uVar59 >> lVar57 & 1) == 0; lVar57 = lVar57 + 1) {
                      }
                    }
                    pGVar66 = (Geometry *)local_17c0._0_8_;
                    pRVar69 = (RTCIntersectArguments *)local_17a0._0_8_;
                  }
                }
              }
            }
            local_1720 = local_1720 & local_1720 - 1;
            auVar147 = ZEXT816(0) << 0x40;
            auVar301 = ZEXT3264(local_14a0);
            context = local_1840;
            ray = local_1848;
            puVar70 = local_1828;
            uVar59 = local_1740;
            uVar71 = local_1748;
          }
          auVar170 = ZEXT3264(local_14e0);
          auVar200 = ZEXT3264(local_15c0);
          auVar223 = ZEXT3264(_local_15e0);
          auVar236 = ZEXT3264(_local_1600);
          auVar252 = ZEXT3264(local_1500);
          auVar269 = ZEXT3264(local_1520);
          auVar273 = ZEXT3264(local_1540);
          auVar157 = ZEXT3264(local_1620);
          This = (Intersectors *)0x0;
        }
        goto LAB_00e836da;
      }
    }
  }
  return;
LAB_00e83834:
  do {
    *puVar70 = uVar67;
    puVar70 = puVar70 + 1;
    This = (Intersectors *)0x0;
    if (uVar62 != 0) {
      for (; (uVar62 >> (long)This & 1) == 0; This = (Intersectors *)((long)&This->ptr + 1)) {
      }
    }
    uVar67 = *(ulong *)(uVar56 + (long)This * 8);
    uVar62 = uVar62 - 1 & uVar62;
  } while (uVar62 != 0);
  goto LAB_00e836eb;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }